

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::SimpleVolPathIntegrator::Li
          (SimpleVolPathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *param_5)

{
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar1;
  float **ppfVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ulong uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  pointer pLVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  short sVar49;
  array<float,_4> aVar50;
  Interval<float> *pIVar51;
  SampledWavelengths *lambda_00;
  ulong uVar52;
  undefined4 extraout_var;
  byte bVar53;
  ulong uVar54;
  LightHandle *light;
  pointer pLVar55;
  long lVar56;
  int iVar57;
  float *pfVar58;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar59;
  HaltonSampler *this_00;
  ImageInfiniteLight *this_01;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar60;
  uint uVar61;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar62;
  size_t *psVar63;
  uintptr_t iptr;
  DenselySampledSpectrum *this_02;
  DebugMLTSampler *this_03;
  long in_FS_OFFSET;
  bool bVar64;
  ulong uVar65;
  int iVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar89 [48];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  float z;
  Float FVar90;
  Interval<float> i;
  Interval<float> i_00;
  Interval<float> i_01;
  Interval<float> i_02;
  Interval<float> i_03;
  Interval<float> i_04;
  Interval<float> IVar91;
  Interval<float> i_05;
  Interval<float> i_06;
  float fVar139;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 extraout_var_00 [12];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar94 [16];
  undefined8 uVar140;
  undefined1 auVar141 [56];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 extraout_var_09 [56];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar138 [64];
  float y;
  float fVar142;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar172 [56];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  float x;
  float fVar179;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar180;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar186;
  undefined1 in_ZMM4 [64];
  float fVar187;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar191;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  Float t0;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [64];
  undefined1 in_ZMM11 [64];
  undefined1 in_ZMM13 [64];
  undefined1 in_XMM15 [16];
  Vector3f woRender;
  SampledSpectrum SVar205;
  bool terminated;
  bool scattered;
  float nextCrossingT [3];
  int voxel [3];
  int numScatters;
  Point3fi o;
  float deltaT [3];
  int step [3];
  int voxelLimit [3];
  SampledSpectrum beta;
  optional<pbrt::ShapeIntersection> si;
  bool local_4ee;
  bool local_4ed;
  float local_4ec;
  undefined1 local_4e8 [8];
  float fStack_4e0;
  float fStack_4dc;
  float local_4d0;
  float local_4cc;
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  float local_49c;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  float **local_488;
  Point3fi local_480;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  Tuple3<pbrt::Point3,_float> local_450;
  int local_444 [3];
  undefined1 local_438 [16];
  int local_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  SimpleVolPathIntegrator *local_3f8;
  float local_3ec;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [8];
  Interval<float> IStack_3d0;
  Interval<float> local_3c8 [17];
  bool local_340;
  SampledSpectrum local_338;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  Interval<float> *local_308;
  long local_300;
  DispatchSplit<8> local_2f4 [12];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  PrimitiveHandle *local_2c0;
  int aiStack_2b4 [3];
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  SampledSpectrum local_298;
  undefined1 local_280 [32];
  int *local_260;
  SimpleVolPathIntegrator *local_258;
  SampledSpectrum *local_250;
  RayDifferential *local_248;
  bool *local_240;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  SampledWavelengths *local_220;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  int aiStack_204 [3];
  undefined1 local_1f8 [16];
  SampledSpectrum local_1e8;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined8 local_168;
  float fStack_160;
  float fStack_15c;
  Interval<float> local_150;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_148;
  ScratchBuffer *local_140;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_138;
  ulong local_38;
  undefined1 auVar76 [64];
  undefined1 auVar72 [16];
  undefined1 auVar81 [64];
  undefined1 auVar86 [64];
  undefined1 auVar69 [16];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 extraout_var_15 [56];
  undefined1 extraout_var_16 [56];
  undefined1 extraout_var_17 [56];
  undefined1 extraout_var_18 [56];
  
  local_298.values.values[0] = 0.0;
  local_298.values.values[1] = 0.0;
  local_298.values.values[2] = 0.0;
  local_298.values.values[3] = 0.0;
  local_1e8.values.values[0] = 1.0;
  local_1e8.values.values[1] = 1.0;
  local_1e8.values.values[2] = 1.0;
  local_1e8.values.values[3] = 1.0;
  local_41c = 0;
  fVar142 = (lambda->pdf).values[1];
  if ((fVar142 == 0.0) && (!NAN(fVar142))) {
    uVar52 = 0;
    while (uVar52 != 2) {
      fVar142 = (lambda->pdf).values[uVar52 + 2];
      uVar52 = uVar52 + 1;
      if ((fVar142 != 0.0) || (NAN(fVar142))) goto LAB_0040f133;
    }
    uVar52 = 3;
LAB_0040f133:
    if (2 < uVar52) goto LAB_0040f15f;
  }
  (lambda->pdf).values[3] = 0.0;
  (lambda->pdf).values[1] = 0.0;
  (lambda->pdf).values[2] = 0.0;
  (lambda->pdf).values[0] = (lambda->pdf).values[0] * 0.25;
LAB_0040f15f:
  local_2c0 = &(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate;
  local_3f8 = this;
  local_308 = (Interval<float> *)sampler;
  local_220 = lambda;
  local_140 = scratchBuffer;
  do {
    *(long *)(in_FS_OFFSET + -0x380) = *(long *)(in_FS_OFFSET + -0x380) + 1;
    if (((local_2c0->
         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
         ).bits & 0xffffffffffff) == 0) {
      in_ZmmResult = ZEXT1664(ZEXT816(0) << 0x40);
      local_38 = 0;
      local_138._0_64_ = in_ZmmResult;
      local_138._64_64_ = in_ZmmResult;
      local_138._128_64_ = in_ZmmResult;
      local_138._192_64_ = in_ZmmResult;
    }
    else {
      in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
      in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
      in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
      PrimitiveHandle::Intersect
                ((optional<pbrt::ShapeIntersection> *)&local_138.__align,local_2c0,&ray->super_Ray,
                 INFINITY);
    }
    pIVar51 = local_308;
    local_4ed = false;
    local_4ee = false;
    if (((ray->super_Ray).medium.
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
         .bits & 0xffffffffffff) != 0) {
      local_4b8 = ZEXT416((uint)((byte)local_38 & 1) * local_138._248_4_ +
                          (uint)!(bool)((byte)local_38 & 1) * 0x7f800000);
      local_3d8 = *(undefined1 (*) [8])local_308;
      in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
      in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
      in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
      FVar90 = detail::DispatchSplit<8>::operator()
                         ((DispatchSplit<8> *)local_280,local_3d8,(ulong)local_3d8 >> 0x30);
      local_4e8._0_4_ = FVar90;
      local_3d8 = (undefined1  [8])*pIVar51;
      FVar90 = detail::DispatchSplit<8>::operator()
                         ((DispatchSplit<8> *)local_280,local_3d8,(ulong)*pIVar51 >> 0x30);
      uVar52 = (CONCAT44(extraout_var,local_4e8._0_4_) ^ 0x1a929e4d6f47a654) * -0x395b586ca42e166b;
      uVar54 = (uVar52 >> 0x2f ^ uVar52) * -0x395b586ca42e166b;
      uVar52 = uVar54 >> 0x2f ^ uVar54;
      uVar54 = (CONCAT44((int)(uVar54 >> 0x20),FVar90) ^ 0x1a929e4d6f47a654) * -0x395b586ca42e166b;
      uVar54 = (uVar54 >> 0x2f ^ uVar54) * -0x395b586ca42e166b;
      local_300 = uVar52 * 2 + 1;
      local_408 = (undefined1  [8])
                  (((uVar54 >> 0x2f ^ uVar54) + 1) * 0x5851f42d4c957f2d +
                   uVar52 * -0x4f5c17a566d501a4 + 1);
      local_488 = (float **)
                  (ray->super_Ray).medium.
                  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                  .bits;
      this_02 = (DenselySampledSpectrum *)((ulong)local_488 & 0xffffffffffff);
      sVar49 = (short)((ulong)local_488 >> 0x30);
      local_280._16_8_ = lambda;
      local_248 = ray;
      if (local_488 < (float **)0x3000000000000) {
        if (sVar49 == 2) {
          local_280._0_8_ = pIVar51;
          local_280._8_8_ = &local_298;
          local_280._24_8_ = &local_4ee;
          local_260 = &local_41c;
          local_258 = local_3f8;
          local_250 = &local_1e8;
          local_240 = &local_4ed;
          fVar142 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar67 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
          auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142)),auVar67,auVar67);
          auVar68 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
          auVar67 = vfmadd213ss_fma(auVar68,auVar68,auVar67);
          if (auVar67._0_4_ < 0.0) {
            fVar142 = sqrtf(auVar67._0_4_);
          }
          else {
            auVar67 = vsqrtss_avx(auVar67,auVar67);
            fVar142 = auVar67._0_4_;
          }
          local_4e8._0_4_ = fVar142;
          fVar142 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar67 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
          auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142)),auVar67,auVar67);
          auVar68 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
          auVar67 = vfmadd213ss_fma(auVar68,auVar68,auVar67);
          if (auVar67._0_4_ < 0.0) {
            fVar142 = sqrtf(auVar67._0_4_);
          }
          else {
            auVar67 = vsqrtss_avx(auVar67,auVar67);
            fVar142 = auVar67._0_4_;
          }
          local_4c8._0_4_ = fVar142;
          local_498._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
          local_438._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          local_418._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
          fVar142 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
          auVar92._4_4_ = fVar142;
          auVar92._0_4_ = fVar142;
          auVar92._8_4_ = fVar142;
          auVar92._12_4_ = fVar142;
          fVar142 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
          auVar143._4_4_ = fVar142;
          auVar143._0_4_ = fVar142;
          auVar143._8_4_ = fVar142;
          auVar143._12_4_ = fVar142;
          local_480.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ = vmovlhps_avx(auVar92,auVar143)
          ;
          fVar142 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
          auVar144._4_4_ = fVar142;
          auVar144._0_4_ = fVar142;
          auVar144._8_4_ = fVar142;
          auVar144._12_4_ = fVar142;
          local_480.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
               (Interval<float>)vmovlps_avx(auVar144);
          Transform::operator()((Point3fi *)local_3d8,(Transform *)(this_02 + 3),&local_480);
          local_468._0_4_ = (float)local_4e8._0_4_ * (float)local_4b8._0_4_;
          auVar93._0_4_ = (float)local_418._0_4_ / (float)local_4c8._0_4_;
          auVar93._4_12_ = SUB6012((undefined1  [60])0x0,0);
          fVar142 = (float)local_438._0_4_ / (float)local_4c8._0_4_;
          auVar68 = ZEXT416((uint)((float)local_498._0_4_ / (float)local_4c8._0_4_));
          auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * (float)this_02[3].lambda_max)),auVar68,
                                    ZEXT416((uint)this_02[3].lambda_min));
          _local_218 = vfmadd231ss_fma(auVar67,auVar93,
                                       ZEXT416(*(uint *)&this_02[3].values.alloc.memoryResource));
          auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 *
                                                  *(float *)((long)&this_02[3].values.ptr + 4))),
                                    auVar68,ZEXT416(*(uint *)&this_02[3].values.ptr));
          local_328 = vfmadd231ss_fma(auVar67,auVar93,ZEXT416((uint)this_02[3].values.nAlloc));
          auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 *
                                                  *(float *)((long)&this_02[3].values.nStored + 4)))
                                    ,auVar68,ZEXT416((uint)this_02[3].values.nStored));
          _local_2a8 = vfmadd231ss_fma(auVar67,auVar93,ZEXT416((uint)this_02[4].lambda_min));
          auVar67 = vfmadd231ss_fma(ZEXT416((uint)(local_328._0_4_ * local_328._0_4_)),_local_218,
                                    _local_218);
          auVar67 = vfmadd231ss_fma(auVar67,_local_2a8,_local_2a8);
          if (0.0 < auVar67._0_4_) {
            auVar181._8_4_ = 0x7fffffff;
            auVar181._0_8_ = 0x7fffffff7fffffff;
            auVar181._12_4_ = 0x7fffffff;
            auVar68 = vandps_avx(_local_218,auVar181);
            auVar94 = vandps_avx(local_328,auVar181);
            auVar145 = vandps_avx(_local_2a8,auVar181);
            auVar68 = vfmadd231ss_fma(ZEXT416((uint)(auVar94._0_4_ * 0.0)),ZEXT816(0) << 0x40,
                                      auVar68);
            auVar68 = vfmadd231ss_fma(auVar68,ZEXT816(0) << 0x40,auVar145);
            fVar142 = auVar68._0_4_ / auVar67._0_4_;
            local_4e8._0_4_ = fVar142;
            fVar142 = local_218._0_4_ * fVar142;
            i.high = fVar142;
            i.low = fVar142;
            auVar108._0_8_ = Interval<float>::operator+<float>((Interval<float> *)local_3d8,i);
            auVar108._8_56_ = extraout_var_03;
            uVar140 = vmovlps_avx(auVar108._0_16_);
            local_3d8 = (undefined1  [8])uVar140;
            i_00.high = (float)local_4e8._0_4_ * (float)local_328._0_4_;
            i_00.low = (float)local_4e8._0_4_ * (float)local_328._0_4_;
            auVar109._0_8_ =
                 Interval<float>::operator+<float>((Interval<float> *)(local_3d8 + 8),i_00);
            auVar109._8_56_ = extraout_var_04;
            uVar140 = vmovlps_avx(auVar109._0_16_);
            IStack_3d0 = (Interval<float>)uVar140;
            i_01.high = (float)local_4e8._0_4_ * (float)local_2a8._0_4_;
            i_01.low = (float)local_4e8._0_4_ * (float)local_2a8._0_4_;
            auVar110._0_8_ = Interval<float>::operator+<float>(local_3c8,i_01);
            auVar110._8_56_ = extraout_var_05;
            local_3c8[0] = (Interval<float>)vmovlps_avx(auVar110._0_16_);
            local_468._0_4_ = (float)local_468._0_4_ - (float)local_4e8._0_4_;
          }
          fVar142 = ((float)local_3d8._0_4_ + (float)local_3d8._4_4_) * 0.5;
          local_438._0_4_ = fVar142;
          local_4ec = (IStack_3d0.low + IStack_3d0.high) * 0.5;
          fVar179 = (local_3c8[0].low + local_3c8[0].high) * 0.5;
          local_3e8._0_4_ = fVar179;
          auVar67 = ZEXT816(0) << 0x40;
          bVar64 = false;
          uVar61 = 0;
          do {
            fVar139 = local_218._0_4_;
            if ((uVar61 != 0) && (fVar139 = local_328._0_4_, uVar61 != 1)) {
              fVar139 = local_2a8._0_4_;
            }
            pvVar62 = &this_02->values;
            if ((uVar61 != 0) &&
               (pvVar62 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                          ((long)&(this_02->values).alloc.memoryResource + 4), uVar61 != 1)) {
              pvVar62 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                        &(this_02->values).ptr;
            }
            fVar180 = fVar142;
            if ((uVar61 != 0) && (fVar180 = local_4ec, uVar61 != 1)) {
              fVar180 = fVar179;
            }
            psVar63 = (size_t *)((long)&(this_02->values).ptr + 4);
            if ((uVar61 != 0) && (psVar63 = &(this_02->values).nAlloc, uVar61 != 1)) {
              psVar63 = (size_t *)((long)&(this_02->values).nAlloc + 4);
            }
            fVar186 = fVar142;
            if ((uVar61 != 0) && (fVar186 = local_4ec, uVar61 != 1)) {
              fVar186 = fVar179;
            }
            in_ZMM4 = ZEXT464(0x3f800000);
            auVar94 = ZEXT416((uint)((1.0 / fVar139) * (*(float *)psVar63 - fVar186)));
            auVar145 = ZEXT416((uint)((1.0 / fVar139) *
                                     (*(float *)&(pvVar62->alloc).memoryResource - fVar180)));
            auVar68 = vminss_avx(auVar94,auVar145);
            auVar67 = vmaxss_avx(auVar68,auVar67);
            auVar68 = vmaxss_avx(auVar145,auVar94);
            auVar68 = vminss_avx(ZEXT416((uint)(auVar68._0_4_ * 1.0000004)),
                                 ZEXT416((uint)local_468._0_4_));
            auVar172 = ZEXT856(auVar68._8_8_);
            local_468._0_4_ = auVar68._0_4_;
            if (auVar68._0_4_ < auVar67._0_4_) break;
            bVar64 = 1 < uVar61;
            uVar61 = uVar61 + 1;
          } while (uVar61 != 3);
          if (bVar64) {
            local_4e8._0_4_ = auVar67._0_4_;
            uVar140 = 0;
            local_4b8 = ZEXT416((uint)this_02[2].values.nStored);
            SVar205 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)&(this_02->values).nStored,lambda);
            auVar154._0_8_ = SVar205.values.values._8_8_;
            auVar154._8_56_ = auVar172;
            local_4c8._8_8_ = uVar140;
            local_4c8._0_8_ = SVar205.values.values._0_8_;
            _local_498 = auVar154._0_16_;
            auVar141 = (undefined1  [56])0x0;
            _local_418 = ZEXT416((uint)this_02[2].values.nStored);
            SVar205 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)&this_02[1].values.nStored,lambda);
            auVar155._0_8_ = SVar205.values.values._8_8_;
            auVar155._8_56_ = auVar172;
            auVar111._0_8_ = SVar205.values.values._0_8_;
            auVar111._8_56_ = auVar141;
            auVar67 = vunpcklpd_avx(local_4c8,_local_498);
            fVar142 = (float)local_4b8._0_4_ * auVar67._0_4_;
            fVar179 = (float)local_4b8._0_4_ * auVar67._4_4_;
            fStack_160 = (float)local_4b8._0_4_ * auVar67._8_4_;
            fStack_15c = (float)local_4b8._0_4_ * auVar67._12_4_;
            auVar67 = vmovlhps_avx(auVar111._0_16_,auVar155._0_16_);
            local_178._0_4_ = (float)local_418._0_4_ * auVar67._0_4_;
            local_178._4_4_ = (float)local_418._0_4_ * auVar67._4_4_;
            fStack_170 = (float)local_418._0_4_ * auVar67._8_4_;
            fStack_16c = (float)local_418._0_4_ * auVar67._12_4_;
            local_168 = CONCAT44(fVar179,fVar142);
            local_1d8._0_4_ = (float)local_178._0_4_ + fVar142;
            local_1d8._4_4_ = (float)local_178._4_4_ + fVar179;
            local_1d8._8_4_ = fStack_170 + fStack_160;
            local_1d8._12_4_ = fStack_16c + fStack_15c;
            auVar204 = ZEXT1664(local_1d8);
            fVar142 = *(float *)&(this_02->values).alloc.memoryResource;
            fVar179 = *(float *)((long)&(this_02->values).alloc.memoryResource + 4);
            fVar180 = *(float *)((long)&(this_02->values).ptr + 4) - fVar142;
            fVar186 = *(float *)&(this_02->values).nAlloc - fVar179;
            fVar139 = *(float *)&(this_02->values).ptr;
            fVar187 = *(float *)((long)&(this_02->values).nAlloc + 4) - fVar139;
            local_49c = (float)local_218._0_4_ / fVar180;
            local_4d0 = (float)local_328._0_4_ / fVar186;
            local_4cc = (float)local_2a8._0_4_ / fVar187;
            fVar142 = ((float)local_438._0_4_ - fVar142) / fVar180 +
                      (float)local_4e8._0_4_ * local_49c;
            fVar179 = (local_4ec - fVar179) / fVar186 + (float)local_4e8._0_4_ * local_4d0;
            fVar139 = ((float)local_3e8._0_4_ - fVar139) / fVar187 +
                      (float)local_4e8._0_4_ * local_4cc;
            pvVar62 = &this_02[10].values;
            fVar180 = 1.0 / (float)*(int *)&this_02[10].values.alloc.memoryResource;
            pvVar1 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                     ((long)&this_02[10].values.alloc.memoryResource + 4);
            fVar186 = 1.0 / (float)*(int *)((long)&this_02[10].values.alloc.memoryResource + 4);
            in_ZMM4 = ZEXT1664(ZEXT416((uint)fVar186));
            ppfVar2 = &this_02[10].values.ptr;
            fVar187 = 1.0 / (float)*(int *)&this_02[10].values.ptr;
            lVar56 = 0;
            do {
              iVar66 = (int)lVar56;
              pfVar58 = &local_49c;
              if (iVar66 != 0) {
                if (iVar66 == 1) {
                  pfVar58 = &local_4d0;
                }
                else {
                  pfVar58 = &local_4cc;
                }
              }
              if ((*pfVar58 == 0.0) && (!NAN(*pfVar58))) {
                pfVar58 = &local_49c;
                if (iVar66 != 0) {
                  if (iVar66 == 1) {
                    pfVar58 = &local_4d0;
                  }
                  else {
                    pfVar58 = &local_4cc;
                  }
                }
                *pfVar58 = 0.0;
              }
              fVar191 = fVar142;
              if ((iVar66 != 0) && (fVar191 = fVar179, iVar66 != 1)) {
                fVar191 = fVar139;
              }
              pvVar59 = pvVar62;
              if ((iVar66 != 0) && (pvVar59 = pvVar1, iVar66 != 1)) {
                pvVar59 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar2;
              }
              pvVar60 = pvVar62;
              if ((iVar66 != 0) && (pvVar60 = pvVar1, iVar66 != 1)) {
                pvVar60 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar2;
              }
              auVar196._0_4_ = (float)(*(int *)&(pvVar60->alloc).memoryResource + -1);
              auVar196._4_12_ = in_ZMM11._4_12_;
              auVar68 = ZEXT416((uint)(fVar191 * (float)*(int *)&(pvVar59->alloc).memoryResource));
              auVar67 = vminss_avx(auVar196,auVar68);
              uVar140 = vcmpss_avx512f(auVar68,ZEXT816(0) << 0x40,1);
              auVar74._16_48_ = in_ZmmResult._16_48_;
              auVar74._0_16_ = auVar67;
              fVar191 = (float)((uint)!(bool)((byte)uVar140 & 1) * auVar67._0_4_);
              in_ZmmResult._4_60_ = auVar74._4_60_;
              in_ZmmResult._0_4_ = (int)fVar191;
              iVar57 = (int)fVar191;
              local_444[lVar56] = iVar57;
              pfVar58 = &local_49c;
              if (iVar66 != 0) {
                if (iVar66 == 1) {
                  pfVar58 = &local_4d0;
                }
                else {
                  pfVar58 = &local_4cc;
                }
              }
              if (0.0 <= *pfVar58) {
                pvVar59 = pvVar62;
                if ((iVar66 != 0) && (pvVar59 = pvVar1, iVar66 != 1)) {
                  pvVar59 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar2;
                }
                fVar191 = fVar142;
                if ((iVar66 != 0) && (fVar191 = fVar179, iVar66 != 1)) {
                  fVar191 = fVar139;
                }
                pfVar58 = &local_49c;
                if (iVar66 != 0) {
                  if (iVar66 == 1) {
                    pfVar58 = &local_4d0;
                  }
                  else {
                    pfVar58 = &local_4cc;
                  }
                }
                *(float *)((long)&local_480 + lVar56 * 4) =
                     (float)local_4e8._0_4_ +
                     ((float)(iVar57 + 1) / (float)*(int *)&(pvVar59->alloc).memoryResource -
                     fVar191) / *pfVar58;
                fVar191 = fVar180;
                if ((iVar66 != 0) && (fVar191 = fVar186, iVar66 != 1)) {
                  fVar191 = fVar187;
                }
                pfVar58 = &local_49c;
                if (iVar66 != 0) {
                  if (iVar66 == 1) {
                    pfVar58 = &local_4d0;
                  }
                  else {
                    pfVar58 = &local_4cc;
                  }
                }
                *(float *)(local_2f4 + lVar56 * 4) = fVar191 / *pfVar58;
                aiStack_2b4[lVar56] = 1;
                pvVar59 = pvVar62;
                if ((iVar66 != 0) && (pvVar59 = pvVar1, iVar66 != 1)) {
                  pvVar59 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar2;
                }
                iVar66 = *(int *)&(pvVar59->alloc).memoryResource;
              }
              else {
                pvVar59 = pvVar62;
                if ((iVar66 != 0) && (pvVar59 = pvVar1, iVar66 != 1)) {
                  pvVar59 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar2;
                }
                fVar191 = fVar142;
                if ((iVar66 != 0) && (fVar191 = fVar179, iVar66 != 1)) {
                  fVar191 = fVar139;
                }
                pfVar58 = &local_49c;
                if (iVar66 != 0) {
                  if (iVar66 == 1) {
                    pfVar58 = &local_4d0;
                  }
                  else {
                    pfVar58 = &local_4cc;
                  }
                }
                *(float *)((long)&local_480 + lVar56 * 4) =
                     (float)local_4e8._0_4_ +
                     ((float)iVar57 / (float)*(int *)&(pvVar59->alloc).memoryResource - fVar191) /
                     *pfVar58;
                auVar67 = ZEXT416((uint)fVar180);
                if ((iVar66 != 0) && (auVar67 = ZEXT416((uint)fVar186), iVar66 != 1)) {
                  auVar67 = ZEXT416((uint)fVar187);
                }
                pfVar58 = &local_49c;
                if (iVar66 != 0) {
                  if (iVar66 == 1) {
                    pfVar58 = &local_4d0;
                  }
                  else {
                    pfVar58 = &local_4cc;
                  }
                }
                auVar11._8_4_ = 0x80000000;
                auVar11._0_8_ = 0x8000000080000000;
                auVar11._12_4_ = 0x80000000;
                in_ZmmResult._0_16_ = vxorps_avx512vl(auVar67,auVar11);
                in_ZmmResult._16_48_ = auVar74._16_48_;
                *(float *)(local_2f4 + lVar56 * 4) = in_ZmmResult._0_4_ / *pfVar58;
                aiStack_2b4[lVar56] = -1;
                iVar66 = -1;
              }
              aiStack_204[lVar56] = iVar66;
              lVar56 = lVar56 + 1;
            } while (lVar56 != 3);
            uVar61 = local_408._4_4_ >> 0xd ^ (uint)((ulong)local_408 >> 0x1b);
            bVar53 = local_408[7] >> 3;
            auVar67 = vcvtusi2ss_avx512f(in_ZMM11._0_16_,uVar61 >> bVar53 | uVar61 << 0x20 - bVar53)
            ;
            uVar52 = (long)local_408 * 0x5851f42d4c957f2d + local_300;
            auVar67 = vminss_avx(ZEXT416((uint)(auVar67._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff))
            ;
            local_4b8._0_4_ = auVar67._0_4_;
            local_188._0_8_ = (ulong)((long)&this_02[2].values.nStored + 4U) | 0x1000000000000;
            fVar142 = (float)local_4e8._0_4_;
            do {
              lVar56 = (long)*(int *)(&DAT_005e6660 +
                                     (ulong)((uint)(local_480.super_Point3<pbrt::Interval<float>_>.
                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high < local_480.
                                                            super_Point3<pbrt::Interval<float>_>.
                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low) |
                                            (uint)(local_480.super_Point3<pbrt::Interval<float>_>.
                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.low < local_480.
                                                           super_Point3<pbrt::Interval<float>_>.
                                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high) * 4 +
                                            (uint)(local_480.super_Point3<pbrt::Interval<float>_>.
                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.low < local_480.
                                                           super_Point3<pbrt::Interval<float>_>.
                                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low) * 2) * 4);
              local_4c8._0_4_ = *(undefined4 *)((long)&local_480 + lVar56 * 4);
              uVar3 = *(undefined4 *)
                       (this_02[9].values.nAlloc +
                       (((long)local_444[2] *
                         (long)*(int *)((long)&this_02[10].values.alloc.memoryResource + 4) +
                        (long)local_444[1]) * (long)*(int *)&this_02[10].values.alloc.memoryResource
                       + (long)local_444[0]) * 4);
              auVar12._4_4_ = uVar3;
              auVar12._0_4_ = uVar3;
              auVar12._8_4_ = uVar3;
              auVar12._12_4_ = uVar3;
              auVar75._16_48_ = in_ZmmResult._16_48_;
              auVar75._0_16_ = vmulps_avx512vl(auVar204._0_16_,auVar12);
              in_ZmmResult = auVar75;
              if (auVar75._0_4_ <= 0.0) {
LAB_0041056b:
                fVar179 = *(float *)((long)&local_480 + lVar56 * 4);
                if (((float)local_468._0_4_ < fVar179) ||
                   (iVar66 = local_444[lVar56], local_444[lVar56] = iVar66 + aiStack_2b4[lVar56],
                   iVar66 + aiStack_2b4[lVar56] == aiStack_204[lVar56])) {
                  bVar64 = false;
                }
                else {
                  *(float *)((long)&local_480 + lVar56 * 4) =
                       fVar179 + *(float *)(local_2f4 + lVar56 * 4);
                  bVar64 = true;
                  fVar142 = (float)local_4c8._0_4_;
                }
              }
              else {
                auVar13._8_4_ = 0x80000000;
                auVar13._0_8_ = 0x8000000080000000;
                auVar13._12_4_ = 0x80000000;
                in_ZmmResult._0_16_ = vxorps_avx512vl(auVar75._0_16_,auVar13);
                in_ZmmResult._16_48_ = auVar75._16_48_;
                _local_498 = auVar75._0_16_;
                _local_408 = in_ZmmResult._0_16_;
                do {
                  local_4e8._0_4_ = fVar142;
                  fVar142 = expf(((float)local_4c8._0_4_ - fVar142) * (float)local_408._0_4_);
                  fVar142 = 1.0 - fVar142;
                  if (fVar142 <= (float)local_4b8._0_4_) {
                    auVar67 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                         ZEXT416((uint)(((float)local_4b8._0_4_ - fVar142) /
                                                       (1.0 - fVar142))));
                    local_4b8._0_4_ = auVar67._0_4_;
                    iVar66 = 8;
LAB_004102af:
                    fVar142 = (float)local_4e8._0_4_;
                  }
                  else {
                    fVar142 = logf(1.0 - (float)local_4b8._0_4_);
                    lambda_00 = local_220;
                    fVar142 = (float)local_4e8._0_4_ - fVar142 / (float)local_498._0_4_;
                    in_ZMM4 = ZEXT464((uint)fVar142);
                    if ((float)local_468._0_4_ <= fVar142) {
                      local_340 = false;
                      local_338.values.values[2] = 1.0;
                      local_338.values.values[0] = 1.0;
                      local_338.values.values[1] = 1.0;
                      local_338.values.values[3] = 1.0;
                      Li::anon_class_72_9_b858679e::operator()
                                ((anon_class_72_9_b858679e *)local_280,(MediumSample *)local_3d8);
                      if (local_340 == true) {
                        local_340 = false;
                      }
                      iVar66 = 1;
                      goto LAB_004102af;
                    }
                    auVar67 = vinsertps_avx(ZEXT416((uint)(fVar142 * (float)local_218._0_4_ +
                                                          (float)local_438._0_4_)),
                                            ZEXT416((uint)(fVar142 * (float)local_328._0_4_ +
                                                          local_4ec)),0x10);
                    local_450.z = fVar142 * (float)local_2a8._0_4_ + (float)local_3e8._0_4_;
                    local_450._0_8_ = vmovlps_avx(auVar67);
                    local_2e8._0_4_ = fVar142;
                    fVar142 = fVar142 - (float)local_4e8._0_4_;
                    auVar95._0_4_ = fVar142 * (float)local_408._0_4_;
                    auVar95._4_4_ = fVar142 * (float)local_408._4_4_;
                    auVar95._8_4_ = fVar142 * fStack_400;
                    auVar95._12_4_ = fVar142 * fStack_3fc;
                    auVar14._8_4_ = 0x3fb8aa3b;
                    auVar14._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar14._12_4_ = 0x3fb8aa3b;
                    auVar89 = in_ZmmResult._16_48_;
                    auVar67 = vmulps_avx512vl(auVar95,auVar14);
                    _local_238 = vroundps_avx(auVar67,9);
                    auVar67 = vsubps_avx(auVar67,_local_238);
                    auVar172 = ZEXT856(auVar67._8_8_);
                    auVar146._8_4_ = 0x3da1d5b6;
                    auVar146._0_8_ = 0x3da1d5b63da1d5b6;
                    auVar146._12_4_ = 0x3da1d5b6;
                    auVar15._8_4_ = 0x3e658299;
                    auVar15._0_8_ = 0x3e6582993e658299;
                    auVar15._12_4_ = 0x3e658299;
                    auVar68 = vfmadd213ps_avx512vl(auVar146,auVar67,auVar15);
                    auVar16._8_4_ = 0x3f3263b7;
                    auVar16._0_8_ = 0x3f3263b73f3263b7;
                    auVar16._12_4_ = 0x3f3263b7;
                    auVar68 = vfmadd213ps_avx512vl(auVar68,auVar67,auVar16);
                    auVar17._8_4_ = 0x3f7ff3bf;
                    auVar17._0_8_ = 0x3f7ff3bf3f7ff3bf;
                    auVar17._12_4_ = 0x3f7ff3bf;
                    _local_418 = vfmadd213ps_avx512vl(auVar68,auVar67,auVar17);
                    auVar141 = ZEXT856(local_418._8_8_);
                    SVar205 = UniformGridMediumProvider::Density
                                        (*(UniformGridMediumProvider **)this_02,
                                         (Point3f *)&local_450,local_220);
                    auVar156._0_8_ = SVar205.values.values._8_8_;
                    auVar156._8_56_ = auVar141;
                    auVar112._0_8_ = SVar205.values.values._0_8_;
                    auVar112._8_56_ = auVar172;
                    local_318 = auVar112._0_16_;
                    local_2d8 = auVar156._0_16_;
                    SVar205 = UniformGridMediumProvider::Le
                                        (*(UniformGridMediumProvider **)this_02,
                                         (Point3f *)&local_450,lambda_00);
                    auVar157._0_8_ = SVar205.values.values._8_8_;
                    auVar157._8_56_ = auVar141;
                    auVar113._0_8_ = SVar205.values.values._0_8_;
                    auVar113._8_56_ = auVar172;
                    auVar67 = vfmadd231ss_fma(ZEXT416((uint)(local_450.y *
                                                            *(float *)((long)&this_02[6].values.
                                                                              alloc.memoryResource +
                                                                      4))),
                                              ZEXT416((uint)local_450.x),
                                              ZEXT416(*(uint *)&this_02[6].values.alloc.
                                                                memoryResource));
                    auVar67 = vfmadd231ss_fma(auVar67,ZEXT416((uint)local_450.z),
                                              ZEXT416(*(uint *)&this_02[6].values.ptr));
                    fVar179 = auVar67._0_4_ + *(float *)((long)&this_02[6].values.ptr + 4);
                    auVar67 = vfmadd231ss_fma(ZEXT416((uint)(local_450.y *
                                                            *(float *)((long)&this_02[6].values.
                                                                              nAlloc + 4))),
                                              ZEXT416((uint)local_450.x),
                                              ZEXT416((uint)this_02[6].values.nAlloc));
                    auVar67 = vfmadd231ss_fma(auVar67,ZEXT416((uint)local_450.z),
                                              ZEXT416((uint)this_02[6].values.nStored));
                    fVar139 = auVar67._0_4_ + *(float *)((long)&this_02[6].values.nStored + 4);
                    auVar67 = vfmadd231ss_fma(ZEXT416((uint)(local_450.y *
                                                            (float)this_02[7].lambda_max)),
                                              ZEXT416((uint)local_450.x),
                                              ZEXT416((uint)this_02[7].lambda_min));
                    auVar67 = vfmadd231ss_fma(auVar67,ZEXT416((uint)local_450.z),
                                              ZEXT416(*(uint *)&this_02[7].values.alloc.
                                                                memoryResource));
                    fVar180 = auVar67._0_4_ +
                              *(float *)((long)&this_02[7].values.alloc.memoryResource + 4);
                    auVar67 = vfmadd231ss_fma(ZEXT416((uint)(local_450.y *
                                                            *(float *)((long)&this_02[7].values.ptr
                                                                      + 4))),
                                              ZEXT416((uint)local_450.x),
                                              ZEXT416(*(uint *)&this_02[7].values.ptr));
                    auVar67 = vfmadd231ss_fma(auVar67,ZEXT416((uint)local_450.z),
                                              ZEXT416((uint)this_02[7].values.nAlloc));
                    fVar186 = auVar67._0_4_ + *(float *)((long)&this_02[7].values.nAlloc + 4);
                    bVar64 = fVar186 == 1.0;
                    fVar142 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
                    auVar67 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x)
                    ;
                    auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142)),auVar67,auVar67);
                    auVar68 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z)
                    ;
                    auVar67 = vfmadd213ss_fma(auVar68,auVar68,auVar67);
                    if (auVar67._0_4_ < 0.0) {
                      local_1b8 = ZEXT416((uint)fVar179);
                      local_1c8 = ZEXT416((uint)fVar139);
                      local_1f8 = ZEXT416((uint)fVar180);
                      local_3ec = fVar186;
                      local_1a8 = auVar157._0_16_;
                      local_198 = auVar113._0_16_;
                      fVar142 = sqrtf(auVar67._0_4_);
                      fVar186 = local_3ec;
                      auVar68 = local_1b8;
                      auVar94 = local_1f8;
                      auVar67 = local_198;
                      fVar139 = (float)local_1c8._0_4_;
                      auVar145 = local_1a8;
                    }
                    else {
                      auVar67 = vsqrtss_avx(auVar67,auVar67);
                      fVar142 = auVar67._0_4_;
                      auVar68 = ZEXT416((uint)fVar179);
                      auVar94 = ZEXT416((uint)fVar180);
                      auVar67 = auVar113._0_16_;
                      auVar145 = auVar157._0_16_;
                    }
                    auVar41 = local_188;
                    auVar71 = _local_498;
                    in_ZMM13 = ZEXT1664(auVar67);
                    auVar173._0_4_ = (int)(float)local_238._0_4_;
                    auVar173._4_4_ = (int)(float)local_238._4_4_;
                    auVar173._8_4_ = (int)fStack_230;
                    auVar173._12_4_ = (int)fStack_22c;
                    auVar18._8_4_ = 0xffffffe1;
                    auVar18._0_8_ = 0xffffffe1ffffffe1;
                    auVar18._12_4_ = 0xffffffe1;
                    uVar54 = vpcmpgtd_avx512vl(auVar173,auVar18);
                    uVar54 = uVar54 & 0xf;
                    auVar19._8_4_ = 0x1e;
                    auVar19._0_8_ = 0x1e0000001e;
                    auVar19._12_4_ = 0x1e;
                    uVar65 = vpcmpgtd_avx512vl(auVar173,auVar19);
                    uVar65 = uVar65 & 0xf;
                    auVar174 = vpslld_avx(auVar173,0x17);
                    auVar174 = vpaddd_avx(auVar174,_local_418);
                    auVar69 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    bVar10 = (bool)((byte)uVar65 & 1);
                    auVar70._0_4_ =
                         (uint)bVar10 * auVar69._0_4_ |
                         (uint)!bVar10 * (uint)((byte)uVar54 & 1) * auVar174._0_4_;
                    bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
                    auVar70._4_4_ =
                         (uint)bVar10 * auVar69._4_4_ |
                         (uint)!bVar10 * (uint)((byte)(uVar54 >> 1) & 1) * auVar174._4_4_;
                    bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
                    auVar70._8_4_ =
                         (uint)bVar10 * auVar69._8_4_ |
                         (uint)!bVar10 * (uint)((byte)(uVar54 >> 2) & 1) * auVar174._8_4_;
                    bVar10 = SUB81(uVar65 >> 3,0);
                    auVar70._12_4_ =
                         (uint)bVar10 * auVar69._12_4_ |
                         (uint)!bVar10 * (uint)(byte)(uVar54 >> 3) * auVar174._12_4_;
                    auVar69 = vshufpd_avx(auVar70,auVar70,1);
                    auVar174 = vmovlhps_avx(local_318,local_2d8);
                    fVar179 = auVar68._0_4_ / fVar186;
                    auVar77._4_12_ = auVar68._4_12_;
                    auVar77._0_4_ = fVar179;
                    fVar180 = auVar94._0_4_ / fVar186;
                    auVar78._4_12_ = auVar94._4_12_;
                    auVar78._0_4_ = fVar180;
                    auVar77._16_48_ = auVar89;
                    auVar76._4_60_ = auVar77._4_60_;
                    auVar76._0_4_ = (uint)bVar64 * (int)auVar68._0_4_ + (uint)!bVar64 * (int)fVar179
                    ;
                    iVar66 = (uint)bVar64 * (int)fVar139 + (uint)!bVar64 * (int)(fVar139 / fVar186);
                    auVar78._16_48_ = auVar89;
                    in_ZmmResult._4_60_ = auVar78._4_60_;
                    in_ZmmResult._0_4_ =
                         (uint)bVar64 * (int)auVar94._0_4_ + (uint)!bVar64 * (int)fVar180;
                    local_3c8[1].low = (ray->super_Ray).time;
                    local_3c8[9].low = auVar174._0_4_ * (float)local_168;
                    local_3c8[9].high = auVar174._4_4_ * local_168._4_4_;
                    local_3c8[10].low = auVar174._8_4_ * fStack_160;
                    local_3c8[10].high = auVar174._12_4_ * fStack_15c;
                    local_3c8[0xb].low = auVar174._0_4_ * (float)local_178._0_4_;
                    local_3c8[0xb].high = auVar174._4_4_ * (float)local_178._4_4_;
                    local_3c8[0xc].low = auVar174._8_4_ * fStack_170;
                    local_3c8[0xc].high = auVar174._12_4_ * fStack_16c;
                    in_ZMM11 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)
                                                 ));
                    local_3c8[2].high =
                         -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z / fVar142;
                    uVar6._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
                    uVar6._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
                    auVar201._0_8_ = uVar6 ^ 0x8000000080000000;
                    auVar201._8_4_ = 0x80000000;
                    auVar201._12_4_ = 0x80000000;
                    auVar96._4_4_ = fVar142;
                    auVar96._0_4_ = fVar142;
                    auVar96._8_4_ = fVar142;
                    auVar96._12_4_ = fVar142;
                    auVar68 = vdivps_avx(auVar201,auVar96);
                    auVar188._4_4_ = iVar66;
                    auVar188._0_4_ = iVar66;
                    auVar188._8_4_ = iVar66;
                    auVar188._12_4_ = iVar66;
                    auVar192._4_4_ = in_ZmmResult._0_4_;
                    auVar192._0_4_ = in_ZmmResult._0_4_;
                    auVar192._8_4_ = in_ZmmResult._0_4_;
                    auVar192._12_4_ = in_ZmmResult._0_4_;
                    local_3c8._24_16_ =
                         ZEXT416((uint)(auVar201._0_8_ >> 0x20) ^ uVar6._4_4_ ^ 0x80000000) << 0x20;
                    local_3c8[5].low = 0.0;
                    local_3c8[0xd].low = (float)local_498._0_4_;
                    local_3c8[0xd].high = (float)local_498._4_4_;
                    local_3c8[0xe].low = fStack_490;
                    local_3c8[0xe].high = fStack_48c;
                    local_340 = true;
                    _local_3d8 = vshufps_avx(auVar76._0_16_,auVar188,0x40);
                    in_ZMM4 = ZEXT1664(_local_3d8);
                    local_3c8[0] = (Interval<float>)vmovlps_avx(auVar192);
                    local_3c8._12_8_ = vmovlps_avx(auVar68);
                    local_3c8[6].low = 0.0;
                    local_3c8[6].high = 0.0;
                    local_3c8[7] = (Interval<float>)local_488;
                    local_3c8[8].low = (float)local_188._0_4_;
                    local_3c8[8].high = (float)local_188._4_4_;
                    local_3c8._120_16_ = vmovlhps_avx(auVar67,auVar145);
                    local_338.values.values = (array<float,_4>)vunpcklpd_avx(auVar70,auVar69);
                    _local_498 = auVar71;
                    local_188 = auVar41;
                    bVar64 = Li::anon_class_72_9_b858679e::operator()
                                       ((anon_class_72_9_b858679e *)local_280,
                                        (MediumSample *)local_3d8);
                    if (local_340 == true) {
                      local_340 = false;
                    }
                    iVar66 = 1;
                    fVar142 = (float)local_4e8._0_4_;
                    if (bVar64) {
                      uVar61 = (uint)(uVar52 >> 0x2d) ^ (uint)(uVar52 >> 0x1b);
                      bVar53 = (byte)(uVar52 >> 0x3b);
                      auVar67 = vcvtusi2ss_avx512f(in_XMM15,uVar61 >> bVar53 |
                                                            uVar61 << 0x20 - bVar53);
                      uVar52 = uVar52 * 0x5851f42d4c957f2d + local_300;
                      auVar67 = vminss_avx(ZEXT416((uint)(auVar67._0_4_ * 2.3283064e-10)),
                                           ZEXT416(0x3f7fffff));
                      local_4b8._0_4_ = auVar67._0_4_;
                      iVar66 = 0;
                      fVar142 = (float)local_2e8._0_4_;
                    }
                  }
                } while (iVar66 == 0);
                if (iVar66 == 8) {
                  auVar204 = ZEXT1664(local_1d8);
                  goto LAB_0041056b;
                }
                bVar64 = false;
                auVar204 = ZEXT1664(local_1d8);
              }
              lambda = local_220;
            } while (bVar64);
          }
        }
        else {
          local_280._0_8_ = pIVar51;
          local_280._8_8_ = &local_298;
          local_280._24_8_ = &local_4ee;
          local_260 = &local_41c;
          local_258 = local_3f8;
          local_250 = &local_1e8;
          local_240 = &local_4ed;
          fVar142 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar67 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
          auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142)),auVar67,auVar67);
          auVar68 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
          auVar67 = vfmadd213ss_fma(auVar68,auVar68,auVar67);
          if (auVar67._0_4_ < 0.0) {
            fVar142 = sqrtf(auVar67._0_4_);
          }
          else {
            auVar67 = vsqrtss_avx(auVar67,auVar67);
            fVar142 = auVar67._0_4_;
          }
          local_488 = (float **)CONCAT44(local_488._4_4_,fVar142);
          fVar142 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar67 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
          auVar68 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142)),auVar67,auVar67);
          auVar172 = ZEXT856(auVar68._8_8_);
          auVar67 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
          auVar67 = vfmadd213ss_fma(auVar67,auVar67,auVar68);
          if (auVar67._0_4_ < 0.0) {
            auVar172 = ZEXT856(auVar68._8_8_);
            auVar119._0_4_ = sqrtf(auVar67._0_4_);
            auVar119._4_60_ = extraout_var_01;
            local_318 = auVar119._0_16_;
          }
          else {
            local_318 = vsqrtss_avx(auVar67,auVar67);
          }
          uVar4 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
          uVar7 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          local_2d8._4_4_ = uVar7;
          local_2d8._0_4_ = uVar4;
          local_2d8._8_8_ = 0;
          local_4ec = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
          local_438._0_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
          local_418._0_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
          local_238._0_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
          uVar140 = 0;
          _local_4e8 = ZEXT416((uint)this_02[3].lambda_min);
          SVar205 = DenselySampledSpectrum::Sample(this_02,lambda);
          auVar161._0_8_ = SVar205.values.values._8_8_;
          auVar161._8_56_ = auVar172;
          local_4c8._8_8_ = uVar140;
          local_4c8._0_8_ = SVar205.values.values._0_8_;
          _local_468 = auVar161._0_16_;
          auVar141 = (undefined1  [56])0x0;
          _local_498 = ZEXT416((uint)this_02[3].lambda_min);
          SVar205 = DenselySampledSpectrum::Sample(this_02 + 1,lambda);
          auVar89 = in_ZmmResult._16_48_;
          auVar162._0_8_ = SVar205.values.values._8_8_;
          auVar162._8_56_ = auVar172;
          auVar120._0_8_ = SVar205.values.values._0_8_;
          auVar120._8_56_ = auVar141;
          auVar67 = vunpcklpd_avx(local_4c8,_local_468);
          auVar183._0_4_ = (float)local_4e8._0_4_ * auVar67._0_4_;
          auVar183._4_4_ = (float)local_4e8._0_4_ * auVar67._4_4_;
          auVar183._8_4_ = (float)local_4e8._0_4_ * auVar67._8_4_;
          auVar183._12_4_ = (float)local_4e8._0_4_ * auVar67._12_4_;
          auVar67 = vmovlhps_avx(auVar120._0_16_,auVar162._0_16_);
          fVar142 = (float)local_498._0_4_ * auVar67._0_4_;
          fVar179 = (float)local_498._0_4_ * auVar67._4_4_;
          fVar139 = (float)local_498._0_4_ * auVar67._8_4_;
          fVar180 = (float)local_498._0_4_ * auVar67._12_4_;
          auVar176._0_4_ = fVar142 + auVar183._0_4_;
          auVar176._4_4_ = fVar179 + auVar183._4_4_;
          auVar176._8_4_ = fVar139 + auVar183._8_4_;
          auVar176._12_4_ = fVar180 + auVar183._12_4_;
          if ((auVar176._0_4_ != 0.0) || (NAN(auVar176._0_4_))) {
            local_468._4_4_ = fVar179;
            local_468._0_4_ = fVar142;
            fStack_460 = fVar139;
            fStack_45c = fVar180;
            local_4b8 = ZEXT416((uint)(local_488._0_4_ * (float)local_4b8._0_4_));
            uVar61 = local_408._4_4_ >> 0xd ^ (uint)((ulong)local_408 >> 0x1b);
            bVar53 = local_408[7] >> 3;
            auVar67 = vcvtusi2ss_avx512f(in_ZMM4._0_16_,uVar61 >> bVar53 | uVar61 << 0x20 - bVar53);
            auVar67 = vminss_avx(ZEXT416((uint)(auVar67._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff))
            ;
            _local_4e8 = auVar176;
            local_4c8 = auVar183;
            fVar142 = logf(1.0 - auVar67._0_4_);
            fVar142 = -fVar142 / (float)local_4e8._0_4_;
            fVar179 = local_4b8._0_4_;
            if (fVar179 <= fVar142) {
              auVar104._0_4_ = (float)local_4e8._0_4_ * -fVar179;
              auVar104._4_4_ = (float)local_4e8._4_4_ * -fVar179;
              auVar104._8_4_ = fStack_4e0 * -fVar179;
              auVar104._12_4_ = fStack_4dc * -fVar179;
              auVar26._8_4_ = 0x3fb8aa3b;
              auVar26._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar26._12_4_ = 0x3fb8aa3b;
              auVar68 = vmulps_avx512vl(auVar104,auVar26);
              auVar67 = vroundps_avx(auVar68,9);
              auVar68 = vsubps_avx(auVar68,auVar67);
              auVar152._0_4_ = (int)auVar67._0_4_;
              auVar152._4_4_ = (int)auVar67._4_4_;
              auVar152._8_4_ = (int)auVar67._8_4_;
              auVar152._12_4_ = (int)auVar67._12_4_;
              auVar27._8_4_ = 0xffffffe1;
              auVar27._0_8_ = 0xffffffe1ffffffe1;
              auVar27._12_4_ = 0xffffffe1;
              uVar52 = vpcmpgtd_avx512vl(auVar152,auVar27);
              uVar52 = uVar52 & 0xf;
              auVar28._8_4_ = 0x1e;
              auVar28._0_8_ = 0x1e0000001e;
              auVar28._12_4_ = 0x1e;
              uVar54 = vpcmpgtd_avx512vl(auVar152,auVar28);
              uVar54 = uVar54 & 0xf;
              auVar178._8_4_ = 0x3da1d5b6;
              auVar178._0_8_ = 0x3da1d5b63da1d5b6;
              auVar178._12_4_ = 0x3da1d5b6;
              auVar29._8_4_ = 0x3e658299;
              auVar29._0_8_ = 0x3e6582993e658299;
              auVar29._12_4_ = 0x3e658299;
              auVar67 = vfmadd213ps_avx512vl(auVar178,auVar68,auVar29);
              auVar30._8_4_ = 0x3f3263b7;
              auVar30._0_8_ = 0x3f3263b73f3263b7;
              auVar30._12_4_ = 0x3f3263b7;
              auVar67 = vfmadd213ps_avx512vl(auVar67,auVar68,auVar30);
              auVar31._8_4_ = 0x3f7ff3bf;
              auVar31._0_8_ = 0x3f7ff3bf3f7ff3bf;
              auVar31._12_4_ = 0x3f7ff3bf;
              auVar67 = vfmadd213ps_avx512vl(auVar67,auVar68,auVar31);
              auVar68 = vpslld_avx(auVar152,0x17);
              auVar67 = vpaddd_avx(auVar68,auVar67);
              auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              bVar64 = (bool)((byte)uVar54 & 1);
              local_338.values.values[0] =
                   (float)((uint)bVar64 * auVar68._0_4_ |
                          (uint)!bVar64 * (uint)((byte)uVar52 & 1) * auVar67._0_4_);
              bVar64 = (bool)((byte)(uVar54 >> 1) & 1);
              local_338.values.values[1] =
                   (float)((uint)bVar64 * auVar68._4_4_ |
                          (uint)!bVar64 * (uint)((byte)(uVar52 >> 1) & 1) * auVar67._4_4_);
              bVar64 = (bool)((byte)(uVar54 >> 2) & 1);
              local_338.values.values[2] =
                   (float)((uint)bVar64 * auVar68._8_4_ |
                          (uint)!bVar64 * (uint)((byte)(uVar52 >> 2) & 1) * auVar67._8_4_);
              bVar64 = SUB81(uVar54 >> 3,0);
              local_338.values.values[3] =
                   (float)((uint)bVar64 * auVar68._12_4_ |
                          (uint)!bVar64 * (uint)(byte)(uVar52 >> 3) * auVar67._12_4_);
              in_ZmmResult._16_48_ = auVar89;
              in_ZmmResult._0_4_ = (int)local_338.values.values[0];
              in_ZmmResult._4_4_ = local_338.values.values[1];
              in_ZmmResult._8_4_ = local_338.values.values[2];
              in_ZmmResult._12_4_ = local_338.values.values[3];
              local_340 = false;
              Li::anon_class_72_9_b858679e::operator()
                        ((anon_class_72_9_b858679e *)local_280,(MediumSample *)local_3d8);
            }
            else {
              local_4b8._0_8_ = CONCAT44(extraout_var_00._0_4_,fVar142) ^ 0x8000000000000000;
              local_4b8._8_4_ = extraout_var_00._4_4_ ^ 0x80000000;
              local_4b8._12_4_ = extraout_var_00._8_4_ ^ 0x80000000;
              auVar101._0_4_ = (float)local_4e8._0_4_ * -fVar142;
              auVar101._4_4_ = (float)local_4e8._4_4_ * -fVar142;
              auVar101._8_4_ = fStack_4e0 * -fVar142;
              auVar101._12_4_ = fStack_4dc * -fVar142;
              auVar20._8_4_ = 0x3fb8aa3b;
              auVar20._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar20._12_4_ = 0x3fb8aa3b;
              auVar67 = vmulps_avx512vl(auVar101,auVar20);
              _local_498 = vroundps_avx(auVar67,9);
              auVar67 = vsubps_avx(auVar67,_local_498);
              auVar172 = ZEXT856(auVar67._8_8_);
              auVar150._8_4_ = 0x3da1d5b6;
              auVar150._0_8_ = 0x3da1d5b63da1d5b6;
              auVar150._12_4_ = 0x3da1d5b6;
              auVar21._8_4_ = 0x3e658299;
              auVar21._0_8_ = 0x3e6582993e658299;
              auVar21._12_4_ = 0x3e658299;
              auVar68 = vfmadd213ps_avx512vl(auVar150,auVar67,auVar21);
              auVar22._8_4_ = 0x3f3263b7;
              auVar22._0_8_ = 0x3f3263b73f3263b7;
              auVar22._12_4_ = 0x3f3263b7;
              auVar68 = vfmadd213ps_avx512vl(auVar68,auVar67,auVar22);
              auVar23._8_4_ = 0x3f7ff3bf;
              auVar23._0_8_ = 0x3f7ff3bf3f7ff3bf;
              auVar23._12_4_ = 0x3f7ff3bf;
              _local_408 = vfmadd213ps_avx512vl(auVar68,auVar67,auVar23);
              auVar141 = ZEXT856(local_408._8_8_);
              SVar205 = DenselySampledSpectrum::Sample(this_02 + 2,lambda);
              auVar174 = _local_468;
              auVar163._0_8_ = SVar205.values.values._8_8_;
              auVar163._8_56_ = auVar141;
              auVar121._0_8_ = SVar205.values.values._0_8_;
              auVar121._8_56_ = auVar172;
              auVar94 = vshufpd_avx(local_4c8,local_4c8,1);
              auVar184._4_4_ = local_318._0_4_;
              auVar184._0_4_ = local_318._0_4_;
              auVar184._8_4_ = local_318._0_4_;
              auVar184._12_4_ = local_318._0_4_;
              auVar67 = vdivps_avx(local_2d8,auVar184);
              in_ZMM11 = ZEXT1664(_local_4e8);
              auVar145 = vshufpd_avx(_local_4e8,_local_4e8,1);
              auVar194._0_4_ = (int)(float)local_498._0_4_;
              auVar194._4_4_ = (int)(float)local_498._4_4_;
              auVar194._8_4_ = (int)fStack_490;
              auVar194._12_4_ = (int)fStack_48c;
              auVar24._8_4_ = 0xffffffe1;
              auVar24._0_8_ = 0xffffffe1ffffffe1;
              auVar24._12_4_ = 0xffffffe1;
              uVar52 = vpcmpgtd_avx512vl(auVar194,auVar24);
              uVar52 = uVar52 & 0xf;
              auVar25._8_4_ = 0x1e;
              auVar25._0_8_ = 0x1e0000001e;
              auVar25._12_4_ = 0x1e;
              uVar54 = vpcmpgtd_avx512vl(auVar194,auVar25);
              uVar54 = uVar54 & 0xf;
              auVar68 = vpslld_avx(auVar194,0x17);
              auVar68 = vpaddd_avx(auVar68,_local_408);
              auVar69 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              bVar64 = (bool)((byte)uVar54 & 1);
              local_338.values.values[0] =
                   (float)((uint)bVar64 * auVar69._0_4_ |
                          (uint)!bVar64 * (uint)((byte)uVar52 & 1) * auVar68._0_4_);
              bVar64 = (bool)((byte)(uVar54 >> 1) & 1);
              local_338.values.values[1] =
                   (float)((uint)bVar64 * auVar69._4_4_ |
                          (uint)!bVar64 * (uint)((byte)(uVar52 >> 1) & 1) * auVar68._4_4_);
              bVar64 = (bool)((byte)(uVar54 >> 2) & 1);
              local_338.values.values[2] =
                   (float)((uint)bVar64 * auVar69._8_4_ |
                          (uint)!bVar64 * (uint)((byte)(uVar52 >> 2) & 1) * auVar68._8_4_);
              bVar64 = SUB81(uVar54 >> 3,0);
              local_338.values.values[3] =
                   (float)((uint)bVar64 * auVar69._12_4_ |
                          (uint)!bVar64 * (uint)(byte)(uVar52 >> 3) * auVar68._12_4_);
              in_ZmmResult._16_48_ = auVar89;
              in_ZmmResult._0_4_ = (int)local_338.values.values[0];
              in_ZmmResult._4_4_ = local_338.values.values[1];
              in_ZmmResult._8_4_ = local_338.values.values[2];
              in_ZmmResult._12_4_ = local_338.values.values[3];
              auVar68 = vmovshdup_avx(auVar67);
              fVar142 = (float)local_4b8._0_4_ * auVar67._0_4_ + (float)local_438._0_4_;
              fVar179 = auVar68._0_4_ * (float)local_4b8._0_4_ + (float)local_418._0_4_;
              fVar139 = (float)local_4b8._0_4_ * (local_4ec / (float)local_318._0_4_) +
                        (float)local_238._0_4_;
              auVar185._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
              auVar185._8_4_ = auVar67._8_4_ ^ 0x80000000;
              auVar185._12_4_ = auVar67._12_4_ ^ 0x80000000;
              local_3c8[2].high = -(local_4ec / (float)local_318._0_4_);
              in_ZMM4 = ZEXT1664(CONCAT412(0x80000000,
                                           CONCAT48(0x80000000,
                                                    CONCAT44(0x80000000,local_3c8[2].high))));
              local_3c8[1].low = (ray->super_Ray).time;
              local_3c8[7] = (Interval<float>)&this_02[0x66666666666].values.ptr;
              local_3c8[8] = (Interval<float>)((ulong)&this_02[3].lambda_max | 0x1000000000000);
              auVar198._4_4_ = fVar142;
              auVar198._0_4_ = fVar142;
              auVar198._8_4_ = fVar142;
              auVar198._12_4_ = fVar142;
              auVar199._4_4_ = fVar179;
              auVar199._0_4_ = fVar179;
              auVar199._8_4_ = fVar179;
              auVar199._12_4_ = fVar179;
              _local_3d8 = vmovlhps_avx(auVar198,auVar199);
              auVar200._4_4_ = fVar139;
              auVar200._0_4_ = fVar139;
              auVar200._8_4_ = fVar139;
              auVar200._12_4_ = fVar139;
              local_3c8._24_12_ = ZEXT812(0);
              local_3c8[4].high = 0;
              local_3c8[5].low = 0.0;
              local_3c8[0xb].low = (float)local_468._0_4_;
              local_3c8[0xb].high = (float)local_468._4_4_;
              local_3c8[0xc].low = fStack_460;
              local_3c8[0xc].high = fStack_45c;
              local_340 = true;
              local_3c8[0] = (Interval<float>)vmovlps_avx(auVar200);
              local_3c8._12_8_ = vmovlps_avx(auVar185);
              local_3c8[6].low = 0.0;
              local_3c8[6].high = 0.0;
              local_3c8._72_16_ = vunpcklpd_avx(local_4c8,auVar94);
              local_3c8._104_16_ = vunpcklpd_avx(_local_4e8,auVar145);
              local_3c8._120_16_ = vmovlhps_avx(auVar121._0_16_,auVar163._0_16_);
              _local_468 = auVar174;
              Li::anon_class_72_9_b858679e::operator()
                        ((anon_class_72_9_b858679e *)local_280,(MediumSample *)local_3d8);
            }
            if (local_340 == true) {
              local_340 = false;
            }
          }
        }
      }
      else if (sVar49 == 3) {
        local_280._0_8_ = local_308;
        local_280._8_8_ = &local_298;
        local_280._24_8_ = &local_4ee;
        local_260 = &local_41c;
        local_258 = local_3f8;
        local_250 = &local_1e8;
        local_240 = &local_4ed;
        fVar142 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar67 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
        auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142)),auVar67,auVar67);
        auVar68 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
        auVar67 = vfmadd213ss_fma(auVar68,auVar68,auVar67);
        if (auVar67._0_4_ < 0.0) {
          fVar142 = sqrtf(auVar67._0_4_);
        }
        else {
          auVar67 = vsqrtss_avx(auVar67,auVar67);
          fVar142 = auVar67._0_4_;
        }
        local_4e8._0_4_ = fVar142;
        fVar142 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar67 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
        auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142)),auVar67,auVar67);
        auVar68 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
        auVar67 = vfmadd213ss_fma(auVar68,auVar68,auVar67);
        if (auVar67._0_4_ < 0.0) {
          fVar142 = sqrtf(auVar67._0_4_);
        }
        else {
          auVar67 = vsqrtss_avx(auVar67,auVar67);
          fVar142 = auVar67._0_4_;
        }
        local_4c8._0_4_ = fVar142;
        local_498._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
        local_438._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
        local_418._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
        fVar142 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
        auVar97._4_4_ = fVar142;
        auVar97._0_4_ = fVar142;
        auVar97._8_4_ = fVar142;
        auVar97._12_4_ = fVar142;
        fVar142 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
        auVar147._4_4_ = fVar142;
        auVar147._0_4_ = fVar142;
        auVar147._8_4_ = fVar142;
        auVar147._12_4_ = fVar142;
        local_480.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ = vmovlhps_avx(auVar97,auVar147);
        fVar142 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
        auVar148._4_4_ = fVar142;
        auVar148._0_4_ = fVar142;
        auVar148._8_4_ = fVar142;
        auVar148._12_4_ = fVar142;
        local_480.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
             (Interval<float>)vmovlps_avx(auVar148);
        Transform::operator()((Point3fi *)local_3d8,(Transform *)(this_02 + 3),&local_480);
        local_468._0_4_ = (float)local_4e8._0_4_ * (float)local_4b8._0_4_;
        auVar98._0_4_ = (float)local_418._0_4_ / (float)local_4c8._0_4_;
        auVar98._4_12_ = SUB6012((undefined1  [60])0x0,0);
        fVar142 = (float)local_438._0_4_ / (float)local_4c8._0_4_;
        auVar68 = ZEXT416((uint)((float)local_498._0_4_ / (float)local_4c8._0_4_));
        auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * (float)this_02[3].lambda_max)),auVar68,
                                  ZEXT416((uint)this_02[3].lambda_min));
        local_328 = vfmadd231ss_fma(auVar67,auVar98,
                                    ZEXT416(*(uint *)&this_02[3].values.alloc.memoryResource));
        auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 *
                                                *(float *)((long)&this_02[3].values.ptr + 4))),
                                  auVar68,ZEXT416(*(uint *)&this_02[3].values.ptr));
        local_2e8 = vfmadd231ss_fma(auVar67,auVar98,ZEXT416((uint)this_02[3].values.nAlloc));
        auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 *
                                                *(float *)((long)&this_02[3].values.nStored + 4))),
                                  auVar68,ZEXT416((uint)this_02[3].values.nStored));
        local_3e8 = vfmadd231ss_fma(auVar67,auVar98,ZEXT416((uint)this_02[4].lambda_min));
        auVar67 = vfmadd231ss_fma(ZEXT416((uint)(local_2e8._0_4_ * local_2e8._0_4_)),local_328,
                                  local_328);
        auVar67 = vfmadd231ss_fma(auVar67,local_3e8,local_3e8);
        if (0.0 < auVar67._0_4_) {
          auVar182._8_4_ = 0x7fffffff;
          auVar182._0_8_ = 0x7fffffff7fffffff;
          auVar182._12_4_ = 0x7fffffff;
          auVar68 = vandps_avx(local_328,auVar182);
          auVar94 = vandps_avx(local_2e8,auVar182);
          auVar145 = vandps_avx(local_3e8,auVar182);
          auVar68 = vfmadd231ss_fma(ZEXT416((uint)(auVar94._0_4_ * 0.0)),ZEXT816(0) << 0x40,auVar68)
          ;
          auVar68 = vfmadd231ss_fma(auVar68,ZEXT816(0) << 0x40,auVar145);
          fVar142 = auVar68._0_4_ / auVar67._0_4_;
          local_4e8._0_4_ = fVar142;
          fVar142 = local_328._0_4_ * fVar142;
          i_02.high = fVar142;
          i_02.low = fVar142;
          auVar114._0_8_ = Interval<float>::operator+<float>((Interval<float> *)local_3d8,i_02);
          auVar114._8_56_ = extraout_var_06;
          uVar140 = vmovlps_avx(auVar114._0_16_);
          local_3d8 = (undefined1  [8])uVar140;
          i_03.high = (float)local_4e8._0_4_ * (float)local_2e8._0_4_;
          i_03.low = (float)local_4e8._0_4_ * (float)local_2e8._0_4_;
          auVar115._0_8_ =
               Interval<float>::operator+<float>((Interval<float> *)(local_3d8 + 8),i_03);
          auVar115._8_56_ = extraout_var_07;
          uVar140 = vmovlps_avx(auVar115._0_16_);
          IStack_3d0 = (Interval<float>)uVar140;
          i_04.high = (float)local_4e8._0_4_ * (float)local_3e8._0_4_;
          i_04.low = (float)local_4e8._0_4_ * (float)local_3e8._0_4_;
          auVar116._0_8_ = Interval<float>::operator+<float>(local_3c8,i_04);
          auVar116._8_56_ = extraout_var_08;
          local_3c8[0] = (Interval<float>)vmovlps_avx(auVar116._0_16_);
          local_468._0_4_ = (float)local_468._0_4_ - (float)local_4e8._0_4_;
        }
        fVar142 = ((float)local_3d8._0_4_ + (float)local_3d8._4_4_) * 0.5;
        local_438._0_4_ = fVar142;
        fVar179 = (IStack_3d0.low + IStack_3d0.high) * 0.5;
        local_318._0_4_ = fVar179;
        local_4ec = (local_3c8[0].low + local_3c8[0].high) * 0.5;
        auVar67 = ZEXT816(0) << 0x40;
        bVar64 = false;
        uVar61 = 0;
        do {
          fVar139 = local_328._0_4_;
          if ((uVar61 != 0) && (fVar139 = local_2e8._0_4_, uVar61 != 1)) {
            fVar139 = local_3e8._0_4_;
          }
          pvVar62 = &this_02->values;
          if ((uVar61 != 0) &&
             (pvVar62 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                        ((long)&(this_02->values).alloc.memoryResource + 4), uVar61 != 1)) {
            pvVar62 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                      &(this_02->values).ptr;
          }
          fVar180 = fVar142;
          if ((uVar61 != 0) && (fVar180 = fVar179, uVar61 != 1)) {
            fVar180 = local_4ec;
          }
          psVar63 = (size_t *)((long)&(this_02->values).ptr + 4);
          if ((uVar61 != 0) && (psVar63 = &(this_02->values).nAlloc, uVar61 != 1)) {
            psVar63 = (size_t *)((long)&(this_02->values).nAlloc + 4);
          }
          fVar186 = fVar142;
          if ((uVar61 != 0) && (fVar186 = fVar179, uVar61 != 1)) {
            fVar186 = local_4ec;
          }
          in_ZMM4 = ZEXT464(0x3f800000);
          auVar94 = ZEXT416((uint)((1.0 / fVar139) * (*(float *)psVar63 - fVar186)));
          auVar145 = ZEXT416((uint)((1.0 / fVar139) *
                                   (*(float *)&(pvVar62->alloc).memoryResource - fVar180)));
          auVar68 = vminss_avx(auVar94,auVar145);
          auVar67 = vmaxss_avx(auVar68,auVar67);
          auVar68 = vmaxss_avx(auVar145,auVar94);
          auVar68 = vminss_avx(ZEXT416((uint)(auVar68._0_4_ * 1.0000004)),
                               ZEXT416((uint)local_468._0_4_));
          auVar172 = ZEXT856(auVar68._8_8_);
          local_468._0_4_ = auVar68._0_4_;
          if (auVar68._0_4_ < auVar67._0_4_) break;
          bVar64 = 1 < uVar61;
          uVar61 = uVar61 + 1;
        } while (uVar61 != 3);
        if (bVar64) {
          local_4e8._0_4_ = auVar67._0_4_;
          uVar140 = 0;
          local_4b8 = ZEXT416((uint)this_02[2].values.nStored);
          SVar205 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)&(this_02->values).nStored,lambda);
          auVar158._0_8_ = SVar205.values.values._8_8_;
          auVar158._8_56_ = auVar172;
          local_4c8._8_8_ = uVar140;
          local_4c8._0_8_ = SVar205.values.values._0_8_;
          _local_498 = auVar158._0_16_;
          auVar141 = (undefined1  [56])0x0;
          _local_418 = ZEXT416((uint)this_02[2].values.nStored);
          SVar205 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)&this_02[1].values.nStored,lambda);
          auVar159._0_8_ = SVar205.values.values._8_8_;
          auVar159._8_56_ = auVar172;
          auVar117._0_8_ = SVar205.values.values._0_8_;
          auVar117._8_56_ = auVar141;
          auVar67 = vunpcklpd_avx(local_4c8,_local_498);
          local_2a8._0_4_ = (float)local_4b8._0_4_ * auVar67._0_4_;
          local_2a8._4_4_ = (float)local_4b8._0_4_ * auVar67._4_4_;
          fStack_2a0 = (float)local_4b8._0_4_ * auVar67._8_4_;
          fStack_29c = (float)local_4b8._0_4_ * auVar67._12_4_;
          auVar67 = vmovlhps_avx(auVar117._0_16_,auVar159._0_16_);
          local_218._0_4_ = (float)local_418._0_4_ * auVar67._0_4_;
          local_218._4_4_ = (float)local_418._0_4_ * auVar67._4_4_;
          fStack_210 = (float)local_418._0_4_ * auVar67._8_4_;
          fStack_20c = (float)local_418._0_4_ * auVar67._12_4_;
          local_1f8._0_4_ = (float)local_218._0_4_ + (float)local_2a8._0_4_;
          local_1f8._4_4_ = (float)local_218._4_4_ + (float)local_2a8._4_4_;
          local_1f8._8_4_ = fStack_210 + fStack_2a0;
          local_1f8._12_4_ = fStack_20c + fStack_29c;
          auVar204 = ZEXT1664(local_1f8);
          fVar142 = *(float *)&(this_02->values).alloc.memoryResource;
          fVar179 = *(float *)((long)&(this_02->values).alloc.memoryResource + 4);
          fVar180 = *(float *)((long)&(this_02->values).ptr + 4) - fVar142;
          fVar186 = *(float *)&(this_02->values).nAlloc - fVar179;
          fVar139 = *(float *)&(this_02->values).ptr;
          fVar187 = *(float *)((long)&(this_02->values).nAlloc + 4) - fVar139;
          local_49c = (float)local_328._0_4_ / fVar180;
          local_4d0 = (float)local_2e8._0_4_ / fVar186;
          local_4cc = (float)local_3e8._0_4_ / fVar187;
          fVar142 = ((float)local_438._0_4_ - fVar142) / fVar180 +
                    (float)local_4e8._0_4_ * local_49c;
          fVar179 = ((float)local_318._0_4_ - fVar179) / fVar186 +
                    (float)local_4e8._0_4_ * local_4d0;
          fVar139 = (local_4ec - fVar139) / fVar187 + (float)local_4e8._0_4_ * local_4cc;
          pvVar62 = &this_02[10].values;
          fVar180 = 1.0 / (float)*(int *)&this_02[10].values.alloc.memoryResource;
          pvVar1 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                   ((long)&this_02[10].values.alloc.memoryResource + 4);
          fVar186 = 1.0 / (float)*(int *)((long)&this_02[10].values.alloc.memoryResource + 4);
          in_ZMM4 = ZEXT1664(ZEXT416((uint)fVar186));
          ppfVar2 = &this_02[10].values.ptr;
          fVar187 = 1.0 / (float)*(int *)&this_02[10].values.ptr;
          lVar56 = 0;
          do {
            iVar66 = (int)lVar56;
            pfVar58 = &local_49c;
            if ((iVar66 != 0) && (pfVar58 = &local_4cc, iVar66 == 1)) {
              pfVar58 = &local_4d0;
            }
            if ((*pfVar58 == 0.0) && (!NAN(*pfVar58))) {
              pfVar58 = &local_49c;
              if ((iVar66 != 0) && (pfVar58 = &local_4cc, iVar66 == 1)) {
                pfVar58 = &local_4d0;
              }
              *pfVar58 = 0.0;
            }
            fVar191 = fVar142;
            if ((iVar66 != 0) && (fVar191 = fVar179, iVar66 != 1)) {
              fVar191 = fVar139;
            }
            pvVar59 = pvVar62;
            if ((iVar66 != 0) && (pvVar59 = pvVar1, iVar66 != 1)) {
              pvVar59 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar2;
            }
            pvVar60 = pvVar62;
            if ((iVar66 != 0) && (pvVar60 = pvVar1, iVar66 != 1)) {
              pvVar60 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar2;
            }
            auVar197._0_4_ = (float)(*(int *)&(pvVar60->alloc).memoryResource + -1);
            auVar197._4_12_ = in_ZMM11._4_12_;
            auVar68 = ZEXT416((uint)(fVar191 * (float)*(int *)&(pvVar59->alloc).memoryResource));
            auVar67 = vminss_avx(auVar197,auVar68);
            uVar140 = vcmpss_avx512f(auVar68,ZEXT816(0) << 0x40,1);
            auVar79._16_48_ = in_ZmmResult._16_48_;
            auVar79._0_16_ = auVar67;
            fVar191 = (float)((uint)!(bool)((byte)uVar140 & 1) * auVar67._0_4_);
            in_ZmmResult._4_60_ = auVar79._4_60_;
            in_ZmmResult._0_4_ = (int)fVar191;
            iVar57 = (int)fVar191;
            local_444[lVar56] = iVar57;
            pfVar58 = &local_49c;
            if ((iVar66 != 0) && (pfVar58 = &local_4cc, iVar66 == 1)) {
              pfVar58 = &local_4d0;
            }
            if (0.0 <= *pfVar58) {
              pvVar59 = pvVar62;
              if ((iVar66 != 0) && (pvVar59 = pvVar1, iVar66 != 1)) {
                pvVar59 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar2;
              }
              fVar191 = fVar142;
              if ((iVar66 != 0) && (fVar191 = fVar179, iVar66 != 1)) {
                fVar191 = fVar139;
              }
              pfVar58 = &local_49c;
              if ((iVar66 != 0) && (pfVar58 = &local_4cc, iVar66 == 1)) {
                pfVar58 = &local_4d0;
              }
              *(float *)((long)&local_480 + lVar56 * 4) =
                   (float)local_4e8._0_4_ +
                   ((float)(iVar57 + 1) / (float)*(int *)&(pvVar59->alloc).memoryResource - fVar191)
                   / *pfVar58;
              fVar191 = fVar180;
              if ((iVar66 != 0) && (fVar191 = fVar186, iVar66 != 1)) {
                fVar191 = fVar187;
              }
              pfVar58 = &local_49c;
              if ((iVar66 != 0) && (pfVar58 = &local_4cc, iVar66 == 1)) {
                pfVar58 = &local_4d0;
              }
              *(float *)(local_2f4 + lVar56 * 4) = fVar191 / *pfVar58;
              aiStack_2b4[lVar56] = 1;
              pvVar59 = pvVar62;
              if ((iVar66 != 0) && (pvVar59 = pvVar1, iVar66 != 1)) {
                pvVar59 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar2;
              }
              iVar66 = *(int *)&(pvVar59->alloc).memoryResource;
            }
            else {
              pvVar59 = pvVar62;
              if ((iVar66 != 0) && (pvVar59 = pvVar1, iVar66 != 1)) {
                pvVar59 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar2;
              }
              fVar191 = fVar142;
              if ((iVar66 != 0) && (fVar191 = fVar179, iVar66 != 1)) {
                fVar191 = fVar139;
              }
              pfVar58 = &local_49c;
              if ((iVar66 != 0) && (pfVar58 = &local_4cc, iVar66 == 1)) {
                pfVar58 = &local_4d0;
              }
              *(float *)((long)&local_480 + lVar56 * 4) =
                   (float)local_4e8._0_4_ +
                   ((float)iVar57 / (float)*(int *)&(pvVar59->alloc).memoryResource - fVar191) /
                   *pfVar58;
              auVar67 = ZEXT416((uint)fVar180);
              if ((iVar66 != 0) && (auVar67 = ZEXT416((uint)fVar186), iVar66 != 1)) {
                auVar67 = ZEXT416((uint)fVar187);
              }
              pfVar58 = &local_49c;
              if ((iVar66 != 0) && (pfVar58 = &local_4cc, iVar66 == 1)) {
                pfVar58 = &local_4d0;
              }
              auVar32._8_4_ = 0x80000000;
              auVar32._0_8_ = 0x8000000080000000;
              auVar32._12_4_ = 0x80000000;
              in_ZmmResult._0_16_ = vxorps_avx512vl(auVar67,auVar32);
              in_ZmmResult._16_48_ = auVar79._16_48_;
              *(float *)(local_2f4 + lVar56 * 4) = in_ZmmResult._0_4_ / *pfVar58;
              aiStack_2b4[lVar56] = -1;
              iVar66 = -1;
            }
            aiStack_204[lVar56] = iVar66;
            lVar56 = lVar56 + 1;
          } while (lVar56 != 3);
          uVar61 = local_408._4_4_ >> 0xd ^ (uint)((ulong)local_408 >> 0x1b);
          bVar53 = local_408[7] >> 3;
          auVar67 = vcvtusi2ss_avx512f(in_ZMM11._0_16_,uVar61 >> bVar53 | uVar61 << 0x20 - bVar53);
          uVar52 = (long)local_408 * 0x5851f42d4c957f2d + local_300;
          auVar67 = vminss_avx(ZEXT416((uint)(auVar67._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
          local_4b8._0_4_ = auVar67._0_4_;
          local_168 = (ulong)((long)&this_02[2].values.nStored + 4U) | 0x1000000000000;
          fVar142 = (float)local_4e8._0_4_;
          do {
            lVar56 = (long)*(int *)(&DAT_005e6660 +
                                   (ulong)((uint)(local_480.super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high <
                                                 local_480.super_Point3<pbrt::Interval<float>_>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
                                                 y.low) |
                                          (uint)(local_480.super_Point3<pbrt::Interval<float>_>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
                                                 x.low < local_480.
                                                         super_Point3<pbrt::Interval<float>_>.
                                                                                                                  
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high) * 4 +
                                          (uint)(local_480.super_Point3<pbrt::Interval<float>_>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
                                                 x.low < local_480.
                                                         super_Point3<pbrt::Interval<float>_>.
                                                                                                                  
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low) * 2) * 4);
            local_4c8._0_4_ = *(undefined4 *)((long)&local_480 + lVar56 * 4);
            uVar3 = *(undefined4 *)
                     (this_02[9].values.nAlloc +
                     (((long)local_444[2] *
                       (long)*(int *)((long)&this_02[10].values.alloc.memoryResource + 4) +
                      (long)local_444[1]) * (long)*(int *)&this_02[10].values.alloc.memoryResource +
                     (long)local_444[0]) * 4);
            auVar33._4_4_ = uVar3;
            auVar33._0_4_ = uVar3;
            auVar33._8_4_ = uVar3;
            auVar33._12_4_ = uVar3;
            auVar80._16_48_ = in_ZmmResult._16_48_;
            auVar80._0_16_ = vmulps_avx512vl(auVar204._0_16_,auVar33);
            in_ZmmResult = auVar80;
            if (auVar80._0_4_ <= 0.0) {
LAB_0041139f:
              fVar179 = *(float *)((long)&local_480 + lVar56 * 4);
              if (((float)local_468._0_4_ < fVar179) ||
                 (iVar66 = local_444[lVar56], local_444[lVar56] = iVar66 + aiStack_2b4[lVar56],
                 iVar66 + aiStack_2b4[lVar56] == aiStack_204[lVar56])) {
                bVar64 = false;
              }
              else {
                *(float *)((long)&local_480 + lVar56 * 4) =
                     fVar179 + *(float *)(local_2f4 + lVar56 * 4);
                bVar64 = true;
                fVar142 = (float)local_4c8._0_4_;
              }
            }
            else {
              auVar34._8_4_ = 0x80000000;
              auVar34._0_8_ = 0x8000000080000000;
              auVar34._12_4_ = 0x80000000;
              in_ZmmResult._0_16_ = vxorps_avx512vl(auVar80._0_16_,auVar34);
              in_ZmmResult._16_48_ = auVar80._16_48_;
              _local_498 = auVar80._0_16_;
              _local_408 = in_ZmmResult._0_16_;
              do {
                local_4e8._0_4_ = fVar142;
                fVar142 = expf(((float)local_4c8._0_4_ - fVar142) * (float)local_408._0_4_);
                fVar142 = 1.0 - fVar142;
                if (fVar142 <= (float)local_4b8._0_4_) {
                  auVar67 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                       ZEXT416((uint)(((float)local_4b8._0_4_ - fVar142) /
                                                     (1.0 - fVar142))));
                  local_4b8._0_4_ = auVar67._0_4_;
                  iVar66 = 8;
LAB_004110fa:
                  fVar142 = (float)local_4e8._0_4_;
                }
                else {
                  fVar142 = logf(1.0 - (float)local_4b8._0_4_);
                  fVar142 = (float)local_4e8._0_4_ - fVar142 / (float)local_498._0_4_;
                  in_ZMM4 = ZEXT464((uint)fVar142);
                  if ((float)local_468._0_4_ <= fVar142) {
                    local_340 = false;
                    local_338.values.values[2] = 1.0;
                    local_338.values.values[0] = 1.0;
                    local_338.values.values[1] = 1.0;
                    local_338.values.values[3] = 1.0;
                    Li::anon_class_72_9_b858679e::operator()
                              ((anon_class_72_9_b858679e *)local_280,(MediumSample *)local_3d8);
                    if (local_340 == true) {
                      local_340 = false;
                    }
                    iVar66 = 1;
                    goto LAB_004110fa;
                  }
                  auVar67 = vinsertps_avx(ZEXT416((uint)(fVar142 * (float)local_328._0_4_ +
                                                        (float)local_438._0_4_)),
                                          ZEXT416((uint)(fVar142 * (float)local_2e8._0_4_ +
                                                        (float)local_318._0_4_)),0x10);
                  local_450.z = fVar142 * (float)local_3e8._0_4_ + local_4ec;
                  local_450._0_8_ = vmovlps_avx(auVar67);
                  local_2d8._0_4_ = fVar142;
                  fVar142 = fVar142 - (float)local_4e8._0_4_;
                  auVar99._0_4_ = fVar142 * (float)local_408._0_4_;
                  auVar99._4_4_ = fVar142 * (float)local_408._4_4_;
                  auVar99._8_4_ = fVar142 * fStack_400;
                  auVar99._12_4_ = fVar142 * fStack_3fc;
                  auVar35._8_4_ = 0x3fb8aa3b;
                  auVar35._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar35._12_4_ = 0x3fb8aa3b;
                  auVar89 = in_ZmmResult._16_48_;
                  auVar67 = vmulps_avx512vl(auVar99,auVar35);
                  _local_238 = vroundps_avx(auVar67,9);
                  auVar67 = vsubps_avx(auVar67,_local_238);
                  auVar172 = ZEXT856(auVar67._8_8_);
                  auVar149._8_4_ = 0x3da1d5b6;
                  auVar149._0_8_ = 0x3da1d5b63da1d5b6;
                  auVar149._12_4_ = 0x3da1d5b6;
                  auVar36._8_4_ = 0x3e658299;
                  auVar36._0_8_ = 0x3e6582993e658299;
                  auVar36._12_4_ = 0x3e658299;
                  auVar68 = vfmadd213ps_avx512vl(auVar149,auVar67,auVar36);
                  auVar37._8_4_ = 0x3f3263b7;
                  auVar37._0_8_ = 0x3f3263b73f3263b7;
                  auVar37._12_4_ = 0x3f3263b7;
                  auVar68 = vfmadd213ps_avx512vl(auVar68,auVar67,auVar37);
                  auVar38._8_4_ = 0x3f7ff3bf;
                  auVar38._0_8_ = 0x3f7ff3bf3f7ff3bf;
                  auVar38._12_4_ = 0x3f7ff3bf;
                  _local_418 = vfmadd213ps_avx512vl(auVar68,auVar67,auVar38);
                  auVar141 = ZEXT856(local_418._8_8_);
                  SVar205 = CloudMediumProvider::Density
                                      (*(CloudMediumProvider **)this_02,(Point3f *)&local_450,lambda
                                      );
                  auVar160._0_8_ = SVar205.values.values._8_8_;
                  auVar160._8_56_ = auVar141;
                  auVar118._0_8_ = SVar205.values.values._0_8_;
                  auVar118._8_56_ = auVar172;
                  auVar67 = vfmadd231ss_fma(ZEXT416((uint)(local_450.y *
                                                          *(float *)((long)&this_02[6].values.alloc.
                                                                            memoryResource + 4))),
                                            ZEXT416((uint)local_450.x),
                                            ZEXT416(*(uint *)&this_02[6].values.alloc.memoryResource
                                                   ));
                  auVar67 = vfmadd231ss_fma(auVar67,ZEXT416((uint)local_450.z),
                                            ZEXT416(*(uint *)&this_02[6].values.ptr));
                  fVar179 = auVar67._0_4_ + *(float *)((long)&this_02[6].values.ptr + 4);
                  auVar67 = vfmadd231ss_fma(ZEXT416((uint)(local_450.y *
                                                          *(float *)((long)&this_02[6].values.nAlloc
                                                                    + 4))),
                                            ZEXT416((uint)local_450.x),
                                            ZEXT416((uint)this_02[6].values.nAlloc));
                  auVar67 = vfmadd231ss_fma(auVar67,ZEXT416((uint)local_450.z),
                                            ZEXT416((uint)this_02[6].values.nStored));
                  fVar139 = auVar67._0_4_ + *(float *)((long)&this_02[6].values.nStored + 4);
                  auVar67 = vfmadd231ss_fma(ZEXT416((uint)(local_450.y *
                                                          (float)this_02[7].lambda_max)),
                                            ZEXT416((uint)local_450.x),
                                            ZEXT416((uint)this_02[7].lambda_min));
                  auVar67 = vfmadd231ss_fma(auVar67,ZEXT416((uint)local_450.z),
                                            ZEXT416(*(uint *)&this_02[7].values.alloc.memoryResource
                                                   ));
                  fVar180 = auVar67._0_4_ +
                            *(float *)((long)&this_02[7].values.alloc.memoryResource + 4);
                  auVar67 = vfmadd231ss_fma(ZEXT416((uint)(local_450.y *
                                                          *(float *)((long)&this_02[7].values.ptr +
                                                                    4))),ZEXT416((uint)local_450.x),
                                            ZEXT416(*(uint *)&this_02[7].values.ptr));
                  auVar67 = vfmadd231ss_fma(auVar67,ZEXT416((uint)local_450.z),
                                            ZEXT416((uint)this_02[7].values.nAlloc));
                  fVar186 = auVar67._0_4_ + *(float *)((long)&this_02[7].values.nAlloc + 4);
                  bVar64 = fVar186 == 1.0;
                  fVar142 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
                  auVar67 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
                  auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142)),auVar67,auVar67);
                  auVar68 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
                  auVar67 = vfmadd213ss_fma(auVar68,auVar68,auVar67);
                  if (auVar67._0_4_ < 0.0) {
                    local_198 = ZEXT416((uint)fVar179);
                    local_1a8 = ZEXT416((uint)fVar139);
                    local_1b8 = ZEXT416((uint)fVar180);
                    local_1c8._0_4_ = fVar186;
                    local_188 = auVar160._0_16_;
                    _local_178 = auVar118._0_16_;
                    fVar142 = sqrtf(auVar67._0_4_);
                    fVar186 = (float)local_1c8._0_4_;
                    auVar68 = local_198;
                    auVar94 = local_1b8;
                    auVar67 = _local_178;
                    fVar139 = (float)local_1a8._0_4_;
                    auVar145 = local_188;
                  }
                  else {
                    auVar67 = vsqrtss_avx(auVar67,auVar67);
                    fVar142 = auVar67._0_4_;
                    auVar68 = ZEXT416((uint)fVar179);
                    auVar94 = ZEXT416((uint)fVar180);
                    auVar67 = auVar118._0_16_;
                    auVar145 = auVar160._0_16_;
                  }
                  auVar69 = _local_498;
                  auVar175._0_4_ = (int)(float)local_238._0_4_;
                  auVar175._4_4_ = (int)(float)local_238._4_4_;
                  auVar175._8_4_ = (int)fStack_230;
                  auVar175._12_4_ = (int)fStack_22c;
                  auVar39._8_4_ = 0xffffffe1;
                  auVar39._0_8_ = 0xffffffe1ffffffe1;
                  auVar39._12_4_ = 0xffffffe1;
                  uVar54 = vpcmpgtd_avx512vl(auVar175,auVar39);
                  uVar54 = uVar54 & 0xf;
                  auVar40._8_4_ = 0x1e;
                  auVar40._0_8_ = 0x1e0000001e;
                  auVar40._12_4_ = 0x1e;
                  uVar65 = vpcmpgtd_avx512vl(auVar175,auVar40);
                  uVar65 = uVar65 & 0xf;
                  auVar174 = vpslld_avx(auVar175,0x17);
                  auVar174 = vpaddd_avx(auVar174,_local_418);
                  auVar71 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  bVar10 = (bool)((byte)uVar65 & 1);
                  auVar72._0_4_ =
                       (uint)bVar10 * auVar71._0_4_ |
                       (uint)!bVar10 * (uint)((byte)uVar54 & 1) * auVar174._0_4_;
                  bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
                  auVar72._4_4_ =
                       (uint)bVar10 * auVar71._4_4_ |
                       (uint)!bVar10 * (uint)((byte)(uVar54 >> 1) & 1) * auVar174._4_4_;
                  bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
                  auVar72._8_4_ =
                       (uint)bVar10 * auVar71._8_4_ |
                       (uint)!bVar10 * (uint)((byte)(uVar54 >> 2) & 1) * auVar174._8_4_;
                  bVar10 = SUB81(uVar65 >> 3,0);
                  auVar72._12_4_ =
                       (uint)bVar10 * auVar71._12_4_ |
                       (uint)!bVar10 * (uint)(byte)(uVar54 >> 3) * auVar174._12_4_;
                  auVar174 = vshufpd_avx(auVar72,auVar72,1);
                  auVar67 = vmovlhps_avx(auVar67,auVar145);
                  fVar179 = auVar68._0_4_ / fVar186;
                  auVar82._4_12_ = auVar68._4_12_;
                  auVar82._0_4_ = fVar179;
                  fVar180 = auVar94._0_4_ / fVar186;
                  auVar83._4_12_ = auVar94._4_12_;
                  auVar83._0_4_ = fVar180;
                  auVar82._16_48_ = auVar89;
                  auVar81._4_60_ = auVar82._4_60_;
                  auVar81._0_4_ = (uint)bVar64 * (int)auVar68._0_4_ + (uint)!bVar64 * (int)fVar179;
                  iVar66 = (uint)bVar64 * (int)fVar139 + (uint)!bVar64 * (int)(fVar139 / fVar186);
                  auVar83._16_48_ = auVar89;
                  in_ZmmResult._4_60_ = auVar83._4_60_;
                  in_ZmmResult._0_4_ =
                       (uint)bVar64 * (int)auVar94._0_4_ + (uint)!bVar64 * (int)fVar180;
                  local_3c8[1].low = (ray->super_Ray).time;
                  local_3c8[9].low = auVar67._0_4_ * (float)local_2a8._0_4_;
                  local_3c8[9].high = auVar67._4_4_ * (float)local_2a8._4_4_;
                  local_3c8[10].low = auVar67._8_4_ * fStack_2a0;
                  local_3c8[10].high = auVar67._12_4_ * fStack_29c;
                  local_3c8[0xb].low = auVar67._0_4_ * (float)local_218._0_4_;
                  local_3c8[0xb].high = auVar67._4_4_ * (float)local_218._4_4_;
                  local_3c8[0xc].low = auVar67._8_4_ * fStack_210;
                  local_3c8[0xc].high = auVar67._12_4_ * fStack_20c;
                  local_3c8[2].high =
                       -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z / fVar142;
                  uVar65._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
                  uVar65._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
                  auVar202._0_8_ = uVar65 ^ 0x8000000080000000;
                  auVar202._8_4_ = 0x80000000;
                  auVar202._12_4_ = 0x80000000;
                  auVar100._4_4_ = fVar142;
                  auVar100._0_4_ = fVar142;
                  auVar100._8_4_ = fVar142;
                  auVar100._12_4_ = fVar142;
                  auVar67 = vdivps_avx(auVar202,auVar100);
                  auVar189._4_4_ = iVar66;
                  auVar189._0_4_ = iVar66;
                  auVar189._8_4_ = iVar66;
                  auVar189._12_4_ = iVar66;
                  auVar193._4_4_ = in_ZmmResult._0_4_;
                  auVar193._0_4_ = in_ZmmResult._0_4_;
                  auVar193._8_4_ = in_ZmmResult._0_4_;
                  auVar193._12_4_ = in_ZmmResult._0_4_;
                  local_3c8._24_16_ =
                       ZEXT416((uint)(auVar202._0_8_ >> 0x20) ^ uVar65._4_4_ ^ 0x80000000) << 0x20;
                  local_3c8[5].low = 0.0;
                  in_ZMM11 = ZEXT1664(_local_498);
                  local_3c8[0xd].low = (float)local_498._0_4_;
                  local_3c8[0xd].high = (float)local_498._4_4_;
                  local_3c8[0xe].low = fStack_490;
                  local_3c8[0xe].high = fStack_48c;
                  local_340 = true;
                  _local_3d8 = vshufps_avx(auVar81._0_16_,auVar189,0x40);
                  in_ZMM4 = ZEXT1664(_local_3d8);
                  local_3c8[0] = (Interval<float>)vmovlps_avx(auVar193);
                  local_3c8._12_8_ = vmovlps_avx(auVar67);
                  local_3c8[6].low = 0.0;
                  local_3c8[6].high = 0.0;
                  local_3c8[7] = (Interval<float>)local_488;
                  local_3c8[8].low = (float)local_168;
                  local_3c8[8].high = local_168._4_4_;
                  local_338.values.values = (array<float,_4>)vunpcklpd_avx(auVar72,auVar174);
                  _local_498 = auVar69;
                  local_3c8._120_16_ = local_3c8._24_16_;
                  bVar64 = Li::anon_class_72_9_b858679e::operator()
                                     ((anon_class_72_9_b858679e *)local_280,
                                      (MediumSample *)local_3d8);
                  if (local_340 == true) {
                    local_340 = false;
                  }
                  iVar66 = 1;
                  lambda = local_220;
                  fVar142 = (float)local_4e8._0_4_;
                  if (bVar64) {
                    uVar61 = (uint)(uVar52 >> 0x2d) ^ (uint)(uVar52 >> 0x1b);
                    bVar53 = (byte)(uVar52 >> 0x3b);
                    auVar67 = vcvtusi2ss_avx512f(in_ZMM13._0_16_,
                                                 uVar61 >> bVar53 | uVar61 << 0x20 - bVar53);
                    uVar52 = uVar52 * 0x5851f42d4c957f2d + local_300;
                    auVar67 = vminss_avx(ZEXT416((uint)(auVar67._0_4_ * 2.3283064e-10)),
                                         ZEXT416(0x3f7fffff));
                    local_4b8._0_4_ = auVar67._0_4_;
                    iVar66 = 0;
                    fVar142 = (float)local_2d8._0_4_;
                  }
                }
              } while (iVar66 == 0);
              if (iVar66 == 8) {
                auVar204 = ZEXT1664(local_1f8);
                goto LAB_0041139f;
              }
              bVar64 = false;
              auVar204 = ZEXT1664(local_1f8);
            }
          } while (bVar64);
        }
      }
      else {
        local_280._0_8_ = local_308;
        local_280._8_8_ = &local_298;
        local_280._24_8_ = &local_4ee;
        local_260 = &local_41c;
        local_258 = local_3f8;
        local_250 = &local_1e8;
        local_240 = &local_4ed;
        fVar142 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar67 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
        auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142)),auVar67,auVar67);
        auVar68 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
        auVar67 = vfmadd213ss_fma(auVar68,auVar68,auVar67);
        if (auVar67._0_4_ < 0.0) {
          fVar142 = sqrtf(auVar67._0_4_);
        }
        else {
          auVar67 = vsqrtss_avx(auVar67,auVar67);
          fVar142 = auVar67._0_4_;
        }
        local_4e8._0_4_ = fVar142;
        fVar142 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar67 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
        auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142)),auVar67,auVar67);
        auVar68 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
        auVar67 = vfmadd213ss_fma(auVar68,auVar68,auVar67);
        if (auVar67._0_4_ < 0.0) {
          fVar142 = sqrtf(auVar67._0_4_);
        }
        else {
          auVar67 = vsqrtss_avx(auVar67,auVar67);
          fVar142 = auVar67._0_4_;
        }
        local_4c8._0_4_ = fVar142;
        local_498._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
        local_488 = (float **)
                    CONCAT44(local_488._4_4_,(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y
                            );
        local_438._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
        fVar142 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
        auVar67._4_4_ = fVar142;
        auVar67._0_4_ = fVar142;
        auVar67._8_4_ = fVar142;
        auVar67._12_4_ = fVar142;
        fVar142 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
        auVar94._4_4_ = fVar142;
        auVar94._0_4_ = fVar142;
        auVar94._8_4_ = fVar142;
        auVar94._12_4_ = fVar142;
        local_480.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ = vmovlhps_avx(auVar67,auVar94);
        fVar142 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
        auVar145._4_4_ = fVar142;
        auVar145._0_4_ = fVar142;
        auVar145._8_4_ = fVar142;
        auVar145._12_4_ = fVar142;
        local_480.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
             (Interval<float>)vmovlps_avx(auVar145);
        Transform::operator()((Point3fi *)local_3d8,(Transform *)(this_02 + 3),&local_480);
        local_468._0_4_ = (float)local_4e8._0_4_ * (float)local_4b8._0_4_;
        auVar68._0_4_ = (float)local_438._0_4_ / (float)local_4c8._0_4_;
        auVar68._4_12_ = SUB6012((undefined1  [60])0x0,0);
        fVar142 = local_488._0_4_ / (float)local_4c8._0_4_;
        auVar94 = ZEXT416((uint)((float)local_498._0_4_ / (float)local_4c8._0_4_));
        auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * (float)this_02[3].lambda_max)),auVar94,
                                  ZEXT416((uint)this_02[3].lambda_min));
        _local_2a8 = vfmadd231ss_fma(auVar67,auVar68,
                                     ZEXT416(*(uint *)&this_02[3].values.alloc.memoryResource));
        auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 *
                                                *(float *)((long)&this_02[3].values.ptr + 4))),
                                  auVar94,ZEXT416(*(uint *)&this_02[3].values.ptr));
        local_3e8 = vfmadd231ss_fma(auVar67,auVar68,ZEXT416((uint)this_02[3].values.nAlloc));
        auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 *
                                                *(float *)((long)&this_02[3].values.nStored + 4))),
                                  auVar94,ZEXT416((uint)this_02[3].values.nStored));
        local_328 = vfmadd231ss_fma(auVar67,auVar68,ZEXT416((uint)this_02[4].lambda_min));
        auVar67 = vfmadd231ss_fma(ZEXT416((uint)(local_3e8._0_4_ * local_3e8._0_4_)),_local_2a8,
                                  _local_2a8);
        auVar67 = vfmadd231ss_fma(auVar67,local_328,local_328);
        if (0.0 < auVar67._0_4_) {
          auVar174._8_4_ = 0x7fffffff;
          auVar174._0_8_ = 0x7fffffff7fffffff;
          auVar174._12_4_ = 0x7fffffff;
          auVar68 = vandps_avx(_local_2a8,auVar174);
          auVar94 = vandps_avx(local_3e8,auVar174);
          auVar145 = vandps_avx(local_328,auVar174);
          auVar68 = vfmadd231ss_fma(ZEXT416((uint)(auVar94._0_4_ * 0.0)),ZEXT816(0) << 0x40,auVar68)
          ;
          auVar68 = vfmadd231ss_fma(auVar68,ZEXT816(0) << 0x40,auVar145);
          fVar142 = auVar68._0_4_ / auVar67._0_4_;
          local_4e8._0_4_ = fVar142;
          fVar142 = local_2a8._0_4_ * fVar142;
          IVar91.high = fVar142;
          IVar91.low = fVar142;
          auVar204._0_8_ = Interval<float>::operator+<float>((Interval<float> *)local_3d8,IVar91);
          auVar204._8_56_ = extraout_var_09;
          uVar140 = vmovlps_avx(auVar204._0_16_);
          local_3d8 = (undefined1  [8])uVar140;
          i_05.high = (float)local_4e8._0_4_ * (float)local_3e8._0_4_;
          i_05.low = (float)local_4e8._0_4_ * (float)local_3e8._0_4_;
          auVar122._0_8_ =
               Interval<float>::operator+<float>((Interval<float> *)(local_3d8 + 8),i_05);
          auVar122._8_56_ = extraout_var_10;
          uVar140 = vmovlps_avx(auVar122._0_16_);
          IStack_3d0 = (Interval<float>)uVar140;
          i_06.high = (float)local_4e8._0_4_ * (float)local_328._0_4_;
          i_06.low = (float)local_4e8._0_4_ * (float)local_328._0_4_;
          auVar123._0_8_ = Interval<float>::operator+<float>(local_3c8,i_06);
          auVar123._8_56_ = extraout_var_11;
          local_3c8[0] = (Interval<float>)vmovlps_avx(auVar123._0_16_);
          local_468._0_4_ = (float)local_468._0_4_ - (float)local_4e8._0_4_;
        }
        fVar142 = ((float)local_3d8._0_4_ + (float)local_3d8._4_4_) * 0.5;
        local_488 = (float **)CONCAT44(local_488._4_4_,fVar142);
        fVar179 = (IStack_3d0.low + IStack_3d0.high) * 0.5;
        local_2d8._0_4_ = fVar179;
        fVar139 = (local_3c8[0].low + local_3c8[0].high) * 0.5;
        local_2e8._0_4_ = fVar139;
        auVar67 = ZEXT816(0) << 0x40;
        bVar64 = false;
        uVar61 = 0;
        do {
          fVar180 = local_2a8._0_4_;
          if ((uVar61 != 0) && (fVar180 = local_3e8._0_4_, uVar61 != 1)) {
            fVar180 = local_328._0_4_;
          }
          pvVar62 = &this_02->values;
          if ((uVar61 != 0) &&
             (pvVar62 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                        ((long)&(this_02->values).alloc.memoryResource + 4), uVar61 != 1)) {
            pvVar62 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                      &(this_02->values).ptr;
          }
          fVar186 = fVar142;
          if ((uVar61 != 0) && (fVar186 = fVar179, uVar61 != 1)) {
            fVar186 = fVar139;
          }
          psVar63 = (size_t *)((long)&(this_02->values).ptr + 4);
          if ((uVar61 != 0) && (psVar63 = &(this_02->values).nAlloc, uVar61 != 1)) {
            psVar63 = (size_t *)((long)&(this_02->values).nAlloc + 4);
          }
          fVar187 = fVar142;
          if ((uVar61 != 0) && (fVar187 = fVar179, uVar61 != 1)) {
            fVar187 = fVar139;
          }
          in_ZMM4 = ZEXT464(0x3f800000);
          auVar94 = ZEXT416((uint)((1.0 / fVar180) * (*(float *)psVar63 - fVar187)));
          auVar145 = ZEXT416((uint)((1.0 / fVar180) *
                                   (*(float *)&(pvVar62->alloc).memoryResource - fVar186)));
          auVar68 = vminss_avx(auVar94,auVar145);
          auVar67 = vmaxss_avx(auVar68,auVar67);
          auVar68 = vmaxss_avx(auVar145,auVar94);
          auVar68 = vminss_avx(ZEXT416((uint)(auVar68._0_4_ * 1.0000004)),
                               ZEXT416((uint)local_468._0_4_));
          auVar172 = ZEXT856(auVar68._8_8_);
          local_468._0_4_ = auVar68._0_4_;
          if (auVar68._0_4_ < auVar67._0_4_) break;
          bVar64 = 1 < uVar61;
          uVar61 = uVar61 + 1;
        } while (uVar61 != 3);
        if (bVar64) {
          local_4e8._0_4_ = auVar67._0_4_;
          uVar140 = 0;
          local_4b8 = ZEXT416((uint)this_02[2].values.nStored);
          SVar205 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)&(this_02->values).nStored,lambda);
          auVar164._0_8_ = SVar205.values.values._8_8_;
          auVar164._8_56_ = auVar172;
          local_4c8._8_8_ = uVar140;
          local_4c8._0_8_ = SVar205.values.values._0_8_;
          _local_498 = auVar164._0_16_;
          auVar141 = (undefined1  [56])0x0;
          local_438 = ZEXT416((uint)this_02[2].values.nStored);
          SVar205 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)&this_02[1].values.nStored,lambda);
          auVar165._0_8_ = SVar205.values.values._8_8_;
          auVar165._8_56_ = auVar172;
          auVar124._0_8_ = SVar205.values.values._0_8_;
          auVar124._8_56_ = auVar141;
          auVar67 = vunpcklpd_avx(local_4c8,_local_498);
          local_218._0_4_ = (float)local_4b8._0_4_ * auVar67._0_4_;
          local_218._4_4_ = (float)local_4b8._0_4_ * auVar67._4_4_;
          fStack_210 = (float)local_4b8._0_4_ * auVar67._8_4_;
          fStack_20c = (float)local_4b8._0_4_ * auVar67._12_4_;
          auVar67 = vmovlhps_avx(auVar124._0_16_,auVar165._0_16_);
          fVar142 = (float)local_438._0_4_ * auVar67._0_4_;
          fVar179 = (float)local_438._0_4_ * auVar67._4_4_;
          fStack_160 = (float)local_438._0_4_ * auVar67._8_4_;
          fStack_15c = (float)local_438._0_4_ * auVar67._12_4_;
          local_168 = CONCAT44(fVar179,fVar142);
          local_1d8._0_4_ = fVar142 + (float)local_218._0_4_;
          local_1d8._4_4_ = fVar179 + (float)local_218._4_4_;
          local_1d8._8_4_ = fStack_160 + fStack_210;
          local_1d8._12_4_ = fStack_15c + fStack_20c;
          auVar204 = ZEXT1664(local_1d8);
          fVar142 = *(float *)&(this_02->values).alloc.memoryResource;
          fVar179 = *(float *)((long)&(this_02->values).alloc.memoryResource + 4);
          fVar180 = *(float *)((long)&(this_02->values).ptr + 4) - fVar142;
          fVar186 = *(float *)&(this_02->values).nAlloc - fVar179;
          fVar139 = *(float *)&(this_02->values).ptr;
          fVar187 = *(float *)((long)&(this_02->values).nAlloc + 4) - fVar139;
          local_49c = (float)local_2a8._0_4_ / fVar180;
          local_4d0 = (float)local_3e8._0_4_ / fVar186;
          local_4cc = (float)local_328._0_4_ / fVar187;
          fVar142 = (local_488._0_4_ - fVar142) / fVar180 + (float)local_4e8._0_4_ * local_49c;
          fVar179 = ((float)local_2d8._0_4_ - fVar179) / fVar186 +
                    (float)local_4e8._0_4_ * local_4d0;
          fVar139 = ((float)local_2e8._0_4_ - fVar139) / fVar187 +
                    (float)local_4e8._0_4_ * local_4cc;
          pvVar62 = &this_02[10].values;
          fVar180 = 1.0 / (float)*(int *)&this_02[10].values.alloc.memoryResource;
          pvVar1 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                   ((long)&this_02[10].values.alloc.memoryResource + 4);
          fVar186 = 1.0 / (float)*(int *)((long)&this_02[10].values.alloc.memoryResource + 4);
          in_ZMM4 = ZEXT1664(ZEXT416((uint)fVar186));
          ppfVar2 = &this_02[10].values.ptr;
          fVar187 = 1.0 / (float)*(int *)&this_02[10].values.ptr;
          lVar56 = 0;
          do {
            iVar66 = (int)lVar56;
            pfVar58 = &local_49c;
            if ((iVar66 != 0) && (pfVar58 = &local_4cc, iVar66 == 1)) {
              pfVar58 = &local_4d0;
            }
            if ((*pfVar58 == 0.0) && (!NAN(*pfVar58))) {
              pfVar58 = &local_49c;
              if ((iVar66 != 0) && (pfVar58 = &local_4cc, iVar66 == 1)) {
                pfVar58 = &local_4d0;
              }
              *pfVar58 = 0.0;
            }
            fVar191 = fVar142;
            if ((iVar66 != 0) && (fVar191 = fVar179, iVar66 != 1)) {
              fVar191 = fVar139;
            }
            pvVar59 = pvVar62;
            if ((iVar66 != 0) && (pvVar59 = pvVar1, iVar66 != 1)) {
              pvVar59 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar2;
            }
            pvVar60 = pvVar62;
            if ((iVar66 != 0) && (pvVar60 = pvVar1, iVar66 != 1)) {
              pvVar60 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar2;
            }
            auVar69._0_4_ = (float)(*(int *)&(pvVar60->alloc).memoryResource + -1);
            auVar69._4_12_ = in_ZMM11._4_12_;
            auVar68 = ZEXT416((uint)(fVar191 * (float)*(int *)&(pvVar59->alloc).memoryResource));
            auVar67 = vminss_avx(auVar69,auVar68);
            uVar140 = vcmpss_avx512f(auVar68,ZEXT816(0) << 0x40,1);
            auVar84._16_48_ = in_ZmmResult._16_48_;
            auVar84._0_16_ = auVar67;
            fVar191 = (float)((uint)!(bool)((byte)uVar140 & 1) * auVar67._0_4_);
            in_ZmmResult._4_60_ = auVar84._4_60_;
            in_ZmmResult._0_4_ = (int)fVar191;
            iVar57 = (int)fVar191;
            local_444[lVar56] = iVar57;
            pfVar58 = &local_49c;
            if ((iVar66 != 0) && (pfVar58 = &local_4cc, iVar66 == 1)) {
              pfVar58 = &local_4d0;
            }
            if (0.0 <= *pfVar58) {
              pvVar59 = pvVar62;
              if ((iVar66 != 0) && (pvVar59 = pvVar1, iVar66 != 1)) {
                pvVar59 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar2;
              }
              fVar191 = fVar142;
              if ((iVar66 != 0) && (fVar191 = fVar179, iVar66 != 1)) {
                fVar191 = fVar139;
              }
              pfVar58 = &local_49c;
              if ((iVar66 != 0) && (pfVar58 = &local_4cc, iVar66 == 1)) {
                pfVar58 = &local_4d0;
              }
              *(float *)((long)&local_480 + lVar56 * 4) =
                   (float)local_4e8._0_4_ +
                   ((float)(iVar57 + 1) / (float)*(int *)&(pvVar59->alloc).memoryResource - fVar191)
                   / *pfVar58;
              fVar191 = fVar180;
              if ((iVar66 != 0) && (fVar191 = fVar186, iVar66 != 1)) {
                fVar191 = fVar187;
              }
              pfVar58 = &local_49c;
              if ((iVar66 != 0) && (pfVar58 = &local_4cc, iVar66 == 1)) {
                pfVar58 = &local_4d0;
              }
              *(float *)(local_2f4 + lVar56 * 4) = fVar191 / *pfVar58;
              aiStack_2b4[lVar56] = 1;
              pvVar59 = pvVar62;
              if ((iVar66 != 0) && (pvVar59 = pvVar1, iVar66 != 1)) {
                pvVar59 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar2;
              }
              iVar66 = *(int *)&(pvVar59->alloc).memoryResource;
            }
            else {
              pvVar59 = pvVar62;
              if ((iVar66 != 0) && (pvVar59 = pvVar1, iVar66 != 1)) {
                pvVar59 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar2;
              }
              fVar191 = fVar142;
              if ((iVar66 != 0) && (fVar191 = fVar179, iVar66 != 1)) {
                fVar191 = fVar139;
              }
              pfVar58 = &local_49c;
              if ((iVar66 != 0) && (pfVar58 = &local_4cc, iVar66 == 1)) {
                pfVar58 = &local_4d0;
              }
              *(float *)((long)&local_480 + lVar56 * 4) =
                   (float)local_4e8._0_4_ +
                   ((float)iVar57 / (float)*(int *)&(pvVar59->alloc).memoryResource - fVar191) /
                   *pfVar58;
              auVar67 = ZEXT416((uint)fVar180);
              if ((iVar66 != 0) && (auVar67 = ZEXT416((uint)fVar186), iVar66 != 1)) {
                auVar67 = ZEXT416((uint)fVar187);
              }
              pfVar58 = &local_49c;
              if ((iVar66 != 0) && (pfVar58 = &local_4cc, iVar66 == 1)) {
                pfVar58 = &local_4d0;
              }
              auVar71._8_4_ = 0x80000000;
              auVar71._0_8_ = 0x8000000080000000;
              auVar71._12_4_ = 0x80000000;
              in_ZmmResult._0_16_ = vxorps_avx512vl(auVar67,auVar71);
              in_ZmmResult._16_48_ = auVar84._16_48_;
              *(float *)(local_2f4 + lVar56 * 4) = in_ZmmResult._0_4_ / *pfVar58;
              aiStack_2b4[lVar56] = -1;
              iVar66 = -1;
            }
            aiStack_204[lVar56] = iVar66;
            lVar56 = lVar56 + 1;
          } while (lVar56 != 3);
          uVar52 = (long)local_408 * 0x5851f42d4c957f2d + local_300;
          uVar61 = local_408._4_4_ >> 0xd ^ (uint)((ulong)local_408 >> 0x1b);
          bVar53 = local_408[7] >> 3;
          auVar67 = vcvtusi2ss_avx512f(in_ZMM11._0_16_,uVar61 >> bVar53 | uVar61 << 0x20 - bVar53);
          auVar67 = vminss_avx(ZEXT416((uint)(auVar67._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
          local_4b8._0_4_ = auVar67._0_4_;
          local_178 = (undefined1  [8])((ulong)this_02 | 0x4000000000000);
          local_188._0_8_ = (ulong)((long)&this_02[2].values.nStored + 4U) | 0x1000000000000;
          fVar142 = (float)local_4e8._0_4_;
          do {
            lVar56 = (long)*(int *)(&DAT_005e6660 +
                                   (ulong)((uint)(local_480.super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high <
                                                 local_480.super_Point3<pbrt::Interval<float>_>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
                                                 y.low) |
                                          (uint)(local_480.super_Point3<pbrt::Interval<float>_>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
                                                 x.low < local_480.
                                                         super_Point3<pbrt::Interval<float>_>.
                                                                                                                  
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high) * 4 +
                                          (uint)(local_480.super_Point3<pbrt::Interval<float>_>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
                                                 x.low < local_480.
                                                         super_Point3<pbrt::Interval<float>_>.
                                                                                                                  
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low) * 2) * 4);
            local_4c8._0_4_ = *(undefined4 *)((long)&local_480 + lVar56 * 4);
            uVar3 = *(undefined4 *)
                     (this_02[9].values.nAlloc +
                     (((long)local_444[2] *
                       (long)*(int *)((long)&this_02[10].values.alloc.memoryResource + 4) +
                      (long)local_444[1]) * (long)*(int *)&this_02[10].values.alloc.memoryResource +
                     (long)local_444[0]) * 4);
            auVar41._4_4_ = uVar3;
            auVar41._0_4_ = uVar3;
            auVar41._8_4_ = uVar3;
            auVar41._12_4_ = uVar3;
            auVar85._16_48_ = in_ZmmResult._16_48_;
            auVar85._0_16_ = vmulps_avx512vl(auVar204._0_16_,auVar41);
            in_ZmmResult = auVar85;
            if (auVar85._0_4_ <= 0.0) {
LAB_0041258d:
              fVar179 = *(float *)((long)&local_480 + lVar56 * 4);
              if (((float)local_468._0_4_ < fVar179) ||
                 (iVar66 = local_444[lVar56], local_444[lVar56] = iVar66 + aiStack_2b4[lVar56],
                 iVar66 + aiStack_2b4[lVar56] == aiStack_204[lVar56])) {
                bVar64 = false;
              }
              else {
                *(float *)((long)&local_480 + lVar56 * 4) =
                     fVar179 + *(float *)(local_2f4 + lVar56 * 4);
                bVar64 = true;
                fVar142 = (float)local_4c8._0_4_;
              }
            }
            else {
              auVar42._8_4_ = 0x80000000;
              auVar42._0_8_ = 0x8000000080000000;
              auVar42._12_4_ = 0x80000000;
              in_ZmmResult._0_16_ = vxorps_avx512vl(auVar85._0_16_,auVar42);
              in_ZmmResult._16_48_ = auVar85._16_48_;
              _local_498 = auVar85._0_16_;
              _local_408 = in_ZmmResult._0_16_;
              do {
                local_4e8._0_4_ = fVar142;
                fVar142 = expf(((float)local_4c8._0_4_ - fVar142) * (float)local_408._0_4_);
                fVar142 = 1.0 - fVar142;
                if (fVar142 <= (float)local_4b8._0_4_) {
                  auVar67 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                       ZEXT416((uint)(((float)local_4b8._0_4_ - fVar142) /
                                                     (1.0 - fVar142))));
                  local_4b8._0_4_ = auVar67._0_4_;
                  iVar66 = 8;
LAB_004122ca:
                  fVar142 = (float)local_4e8._0_4_;
                }
                else {
                  fVar142 = logf(1.0 - (float)local_4b8._0_4_);
                  fVar142 = (float)local_4e8._0_4_ - fVar142 / (float)local_498._0_4_;
                  in_ZMM4 = ZEXT464((uint)fVar142);
                  if ((float)local_468._0_4_ <= fVar142) {
                    local_340 = false;
                    local_338.values.values[2] = 1.0;
                    local_338.values.values[0] = 1.0;
                    local_338.values.values[1] = 1.0;
                    local_338.values.values[3] = 1.0;
                    Li::anon_class_72_9_b858679e::operator()
                              ((anon_class_72_9_b858679e *)local_280,(MediumSample *)local_3d8);
                    if (local_340 == true) {
                      local_340 = false;
                    }
                    iVar66 = 1;
                    goto LAB_004122ca;
                  }
                  auVar67 = vinsertps_avx(ZEXT416((uint)(fVar142 * (float)local_2a8._0_4_ +
                                                        local_488._0_4_)),
                                          ZEXT416((uint)(fVar142 * (float)local_3e8._0_4_ +
                                                        (float)local_2d8._0_4_)),0x10);
                  local_450.z = fVar142 * (float)local_328._0_4_ + (float)local_2e8._0_4_;
                  local_450._0_8_ = vmovlps_avx(auVar67);
                  fVar179 = fVar142 - (float)local_4e8._0_4_;
                  auVar102._0_4_ = fVar179 * (float)local_408._0_4_;
                  auVar102._4_4_ = fVar179 * (float)local_408._4_4_;
                  auVar102._8_4_ = fVar179 * fStack_400;
                  auVar102._12_4_ = fVar179 * fStack_3fc;
                  auVar43._8_4_ = 0x3fb8aa3b;
                  auVar43._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar43._12_4_ = 0x3fb8aa3b;
                  auVar89 = in_ZmmResult._16_48_;
                  auVar67 = vmulps_avx512vl(auVar102,auVar43);
                  _local_418 = vroundps_avx(auVar67,9);
                  auVar67 = vsubps_avx(auVar67,_local_418);
                  auVar172 = ZEXT856(auVar67._8_8_);
                  auVar151._8_4_ = 0x3da1d5b6;
                  auVar151._0_8_ = 0x3da1d5b63da1d5b6;
                  auVar151._12_4_ = 0x3da1d5b6;
                  auVar44._8_4_ = 0x3e658299;
                  auVar44._0_8_ = 0x3e6582993e658299;
                  auVar44._12_4_ = 0x3e658299;
                  auVar68 = vfmadd213ps_avx512vl(auVar151,auVar67,auVar44);
                  auVar45._8_4_ = 0x3f3263b7;
                  auVar45._0_8_ = 0x3f3263b73f3263b7;
                  auVar45._12_4_ = 0x3f3263b7;
                  auVar68 = vfmadd213ps_avx512vl(auVar68,auVar67,auVar45);
                  auVar46._8_4_ = 0x3f7ff3bf;
                  auVar46._0_8_ = 0x3f7ff3bf3f7ff3bf;
                  auVar46._12_4_ = 0x3f7ff3bf;
                  local_438 = vfmadd213ps_avx512vl(auVar68,auVar67,auVar46);
                  auVar141 = ZEXT856(local_438._8_8_);
                  local_4ec = fVar142;
                  SVar205 = NanoVDBMediumProvider::Density
                                      (*(NanoVDBMediumProvider **)this_02,(Point3f *)&local_450,
                                       lambda);
                  auVar166._0_8_ = SVar205.values.values._8_8_;
                  auVar166._8_56_ = auVar141;
                  auVar125._0_8_ = SVar205.values.values._0_8_;
                  auVar125._8_56_ = auVar172;
                  _local_238 = auVar125._0_16_;
                  local_318 = auVar166._0_16_;
                  SVar205 = NanoVDBMediumProvider::Le
                                      (*(NanoVDBMediumProvider **)this_02,(Point3f *)&local_450,
                                       lambda);
                  auVar167._0_8_ = SVar205.values.values._8_8_;
                  auVar167._8_56_ = auVar141;
                  auVar126._0_8_ = SVar205.values.values._0_8_;
                  auVar126._8_56_ = auVar172;
                  auVar67 = vfmadd231ss_fma(ZEXT416((uint)(local_450.y *
                                                          *(float *)((long)&this_02[6].values.alloc.
                                                                            memoryResource + 4))),
                                            ZEXT416((uint)local_450.x),
                                            ZEXT416(*(uint *)&this_02[6].values.alloc.memoryResource
                                                   ));
                  auVar67 = vfmadd231ss_fma(auVar67,ZEXT416((uint)local_450.z),
                                            ZEXT416(*(uint *)&this_02[6].values.ptr));
                  fVar179 = auVar67._0_4_ + *(float *)((long)&this_02[6].values.ptr + 4);
                  auVar67 = vfmadd231ss_fma(ZEXT416((uint)(local_450.y *
                                                          *(float *)((long)&this_02[6].values.nAlloc
                                                                    + 4))),
                                            ZEXT416((uint)local_450.x),
                                            ZEXT416((uint)this_02[6].values.nAlloc));
                  auVar67 = vfmadd231ss_fma(auVar67,ZEXT416((uint)local_450.z),
                                            ZEXT416((uint)this_02[6].values.nStored));
                  fVar139 = auVar67._0_4_ + *(float *)((long)&this_02[6].values.nStored + 4);
                  auVar67 = vfmadd231ss_fma(ZEXT416((uint)(local_450.y *
                                                          (float)this_02[7].lambda_max)),
                                            ZEXT416((uint)local_450.x),
                                            ZEXT416((uint)this_02[7].lambda_min));
                  auVar67 = vfmadd231ss_fma(auVar67,ZEXT416((uint)local_450.z),
                                            ZEXT416(*(uint *)&this_02[7].values.alloc.memoryResource
                                                   ));
                  fVar180 = auVar67._0_4_ +
                            *(float *)((long)&this_02[7].values.alloc.memoryResource + 4);
                  auVar67 = vfmadd231ss_fma(ZEXT416((uint)(local_450.y *
                                                          *(float *)((long)&this_02[7].values.ptr +
                                                                    4))),ZEXT416((uint)local_450.x),
                                            ZEXT416(*(uint *)&this_02[7].values.ptr));
                  auVar67 = vfmadd231ss_fma(auVar67,ZEXT416((uint)local_450.z),
                                            ZEXT416((uint)this_02[7].values.nAlloc));
                  fVar186 = auVar67._0_4_ + *(float *)((long)&this_02[7].values.nAlloc + 4);
                  bVar64 = fVar186 == 1.0;
                  fVar142 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
                  auVar67 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
                  auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142)),auVar67,auVar67);
                  auVar68 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
                  auVar67 = vfmadd213ss_fma(auVar68,auVar68,auVar67);
                  if (auVar67._0_4_ < 0.0) {
                    local_1b8 = ZEXT416((uint)fVar179);
                    local_1c8 = ZEXT416((uint)fVar139);
                    local_1f8 = ZEXT416((uint)fVar180);
                    local_3ec = fVar186;
                    local_1a8 = auVar167._0_16_;
                    local_198 = auVar126._0_16_;
                    fVar142 = sqrtf(auVar67._0_4_);
                    fVar186 = local_3ec;
                    auVar68 = local_1b8;
                    auVar94 = local_1f8;
                    auVar67 = local_198;
                    fVar139 = (float)local_1c8._0_4_;
                    auVar145 = local_1a8;
                  }
                  else {
                    auVar67 = vsqrtss_avx(auVar67,auVar67);
                    fVar142 = auVar67._0_4_;
                    auVar68 = ZEXT416((uint)fVar179);
                    auVar94 = ZEXT416((uint)fVar180);
                    auVar67 = auVar126._0_16_;
                    auVar145 = auVar167._0_16_;
                  }
                  auVar42 = _local_178;
                  auVar41 = local_188;
                  auVar71 = _local_498;
                  in_ZMM13 = ZEXT1664(auVar67);
                  auVar177._0_4_ = (int)(float)local_418._0_4_;
                  auVar177._4_4_ = (int)(float)local_418._4_4_;
                  auVar177._8_4_ = (int)fStack_410;
                  auVar177._12_4_ = (int)fStack_40c;
                  auVar47._8_4_ = 0xffffffe1;
                  auVar47._0_8_ = 0xffffffe1ffffffe1;
                  auVar47._12_4_ = 0xffffffe1;
                  uVar54 = vpcmpgtd_avx512vl(auVar177,auVar47);
                  uVar54 = uVar54 & 0xf;
                  auVar48._8_4_ = 0x1e;
                  auVar48._0_8_ = 0x1e0000001e;
                  auVar48._12_4_ = 0x1e;
                  uVar65 = vpcmpgtd_avx512vl(auVar177,auVar48);
                  uVar65 = uVar65 & 0xf;
                  auVar174 = vpslld_avx(auVar177,0x17);
                  auVar174 = vpaddd_avx(auVar174,local_438);
                  auVar69 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  bVar10 = (bool)((byte)uVar65 & 1);
                  auVar73._0_4_ =
                       (uint)bVar10 * auVar69._0_4_ |
                       (uint)!bVar10 * (uint)((byte)uVar54 & 1) * auVar174._0_4_;
                  bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
                  auVar73._4_4_ =
                       (uint)bVar10 * auVar69._4_4_ |
                       (uint)!bVar10 * (uint)((byte)(uVar54 >> 1) & 1) * auVar174._4_4_;
                  bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
                  auVar73._8_4_ =
                       (uint)bVar10 * auVar69._8_4_ |
                       (uint)!bVar10 * (uint)((byte)(uVar54 >> 2) & 1) * auVar174._8_4_;
                  bVar10 = SUB81(uVar65 >> 3,0);
                  auVar73._12_4_ =
                       (uint)bVar10 * auVar69._12_4_ |
                       (uint)!bVar10 * (uint)(byte)(uVar54 >> 3) * auVar174._12_4_;
                  auVar69 = vshufpd_avx(auVar73,auVar73,1);
                  auVar174 = vmovlhps_avx(_local_238,local_318);
                  fVar179 = auVar68._0_4_ / fVar186;
                  auVar87._4_12_ = auVar68._4_12_;
                  auVar87._0_4_ = fVar179;
                  fVar180 = auVar94._0_4_ / fVar186;
                  auVar88._4_12_ = auVar94._4_12_;
                  auVar88._0_4_ = fVar180;
                  auVar87._16_48_ = auVar89;
                  auVar86._4_60_ = auVar87._4_60_;
                  auVar86._0_4_ = (uint)bVar64 * (int)auVar68._0_4_ + (uint)!bVar64 * (int)fVar179;
                  iVar66 = (uint)bVar64 * (int)fVar139 + (uint)!bVar64 * (int)(fVar139 / fVar186);
                  auVar88._16_48_ = auVar89;
                  in_ZmmResult._4_60_ = auVar88._4_60_;
                  in_ZmmResult._0_4_ =
                       (uint)bVar64 * (int)auVar94._0_4_ + (uint)!bVar64 * (int)fVar180;
                  local_3c8[1].low = (ray->super_Ray).time;
                  local_3c8[9].low = auVar174._0_4_ * (float)local_218._0_4_;
                  local_3c8[9].high = auVar174._4_4_ * (float)local_218._4_4_;
                  local_3c8[10].low = auVar174._8_4_ * fStack_210;
                  local_3c8[10].high = auVar174._12_4_ * fStack_20c;
                  local_3c8[0xb].low = auVar174._0_4_ * (float)local_168;
                  local_3c8[0xb].high = auVar174._4_4_ * local_168._4_4_;
                  local_3c8[0xc].low = auVar174._8_4_ * fStack_160;
                  local_3c8[0xc].high = auVar174._12_4_ * fStack_15c;
                  in_ZMM11 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)))
                  ;
                  local_3c8[2].high =
                       -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z / fVar142;
                  uVar54._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
                  uVar54._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
                  auVar203._0_8_ = uVar54 ^ 0x8000000080000000;
                  auVar203._8_4_ = 0x80000000;
                  auVar203._12_4_ = 0x80000000;
                  auVar103._4_4_ = fVar142;
                  auVar103._0_4_ = fVar142;
                  auVar103._8_4_ = fVar142;
                  auVar103._12_4_ = fVar142;
                  auVar68 = vdivps_avx(auVar203,auVar103);
                  auVar190._4_4_ = iVar66;
                  auVar190._0_4_ = iVar66;
                  auVar190._8_4_ = iVar66;
                  auVar190._12_4_ = iVar66;
                  auVar195._4_4_ = in_ZmmResult._0_4_;
                  auVar195._0_4_ = in_ZmmResult._0_4_;
                  auVar195._8_4_ = in_ZmmResult._0_4_;
                  auVar195._12_4_ = in_ZmmResult._0_4_;
                  local_3c8._24_16_ =
                       ZEXT416((uint)(auVar203._0_8_ >> 0x20) ^ uVar54._4_4_ ^ 0x80000000) << 0x20;
                  local_3c8[5].low = 0.0;
                  local_3c8[0xd].low = (float)local_498._0_4_;
                  local_3c8[0xd].high = (float)local_498._4_4_;
                  local_3c8[0xe].low = fStack_490;
                  local_3c8[0xe].high = fStack_48c;
                  local_340 = true;
                  _local_3d8 = vshufps_avx(auVar86._0_16_,auVar190,0x40);
                  in_ZMM4 = ZEXT1664(_local_3d8);
                  local_3c8[0] = (Interval<float>)vmovlps_avx(auVar195);
                  local_3c8._12_8_ = vmovlps_avx(auVar68);
                  local_3c8[6].low = 0.0;
                  local_3c8[6].high = 0.0;
                  local_3c8[7].low = (float)local_178._0_4_;
                  local_3c8[7].high = (float)local_178._4_4_;
                  local_3c8[8].low = (float)local_188._0_4_;
                  local_3c8[8].high = (float)local_188._4_4_;
                  local_3c8._120_16_ = vmovlhps_avx(auVar67,auVar145);
                  local_338.values.values = (array<float,_4>)vunpcklpd_avx(auVar73,auVar69);
                  _local_498 = auVar71;
                  local_188 = auVar41;
                  _local_178 = auVar42;
                  bVar64 = Li::anon_class_72_9_b858679e::operator()
                                     ((anon_class_72_9_b858679e *)local_280,
                                      (MediumSample *)local_3d8);
                  if (local_340 == true) {
                    local_340 = false;
                  }
                  iVar66 = 1;
                  lambda = local_220;
                  fVar142 = (float)local_4e8._0_4_;
                  if (bVar64) {
                    uVar61 = (uint)(uVar52 >> 0x2d) ^ (uint)(uVar52 >> 0x1b);
                    bVar53 = (byte)(uVar52 >> 0x3b);
                    auVar67 = vcvtusi2ss_avx512f(in_XMM15,uVar61 >> bVar53 | uVar61 << 0x20 - bVar53
                                                );
                    uVar52 = uVar52 * 0x5851f42d4c957f2d + local_300;
                    auVar67 = vminss_avx(ZEXT416((uint)(auVar67._0_4_ * 2.3283064e-10)),
                                         ZEXT416(0x3f7fffff));
                    local_4b8._0_4_ = auVar67._0_4_;
                    iVar66 = 0;
                    fVar142 = local_4ec;
                  }
                }
              } while (iVar66 == 0);
              if (iVar66 == 8) {
                auVar204 = ZEXT1664(local_1d8);
                goto LAB_0041258d;
              }
              bVar64 = false;
              auVar204 = ZEXT1664(local_1d8);
            }
          } while (bVar64);
        }
      }
    }
    auVar89 = in_ZmmResult._16_48_;
    if (local_4ee == false) {
      iVar66 = 0;
      if (local_4ed == false) {
        if ((byte)local_38 == '\0') {
          pLVar9 = *(pointer *)
                    ((long)&(local_3f8->super_RayIntegrator).super_ImageTileIntegrator.
                            super_Integrator.infiniteLights.
                            super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                            ._M_impl.super__Vector_impl_data + 8);
          for (pLVar55 = (local_3f8->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator
                         .infiniteLights.
                         super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                         _M_impl.super__Vector_impl_data._M_start; pLVar55 != pLVar9;
              pLVar55 = pLVar55 + 1) {
            auVar89 = in_ZmmResult._16_48_;
            uVar52 = (pLVar55->
                     super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                     ).bits;
            auVar67 = ZEXT816(0) << 0x40;
            auVar68 = ZEXT816(0) << 0x40;
            if (0x6ffffffffffff < uVar52) {
              this_01 = (ImageInfiniteLight *)(uVar52 & 0xffffffffffff);
              auVar67 = in_ZMM4._0_16_;
              auVar68 = in_ZMM11._0_16_;
              auVar94 = in_ZMM13._0_16_;
              if (uVar52 >> 0x30 == 8) {
                auVar172 = ZEXT856(0);
                auVar141 = ZEXT856(0);
                in_ZMM4 = ZEXT1664(auVar67);
                in_ZMM11 = ZEXT1664(auVar68);
                in_ZMM13 = ZEXT1664(auVar94);
                SVar205 = ImageInfiniteLight::Le(this_01,&ray->super_Ray,lambda);
                auVar170._0_8_ = SVar205.values.values._8_8_;
                auVar170._8_56_ = auVar141;
                auVar68 = auVar170._0_16_;
                auVar130._0_8_ = SVar205.values.values._0_8_;
                auVar130._8_56_ = auVar172;
                auVar67 = auVar130._0_16_;
              }
              else if ((short)(uVar52 >> 0x30) == 7) {
                auVar172 = ZEXT856(0);
                auVar141 = ZEXT856(0);
                in_ZMM4 = ZEXT1664(auVar67);
                in_ZMM11 = ZEXT1664(auVar68);
                in_ZMM13 = ZEXT1664(auVar94);
                SVar205 = UniformInfiniteLight::Le
                                    ((UniformInfiniteLight *)this_01,&ray->super_Ray,lambda);
                auVar169._0_8_ = SVar205.values.values._8_8_;
                auVar169._8_56_ = auVar141;
                auVar68 = auVar169._0_16_;
                auVar129._0_8_ = SVar205.values.values._0_8_;
                auVar129._8_56_ = auVar172;
                auVar67 = auVar129._0_16_;
              }
              else {
                auVar172 = ZEXT856(0);
                auVar141 = ZEXT856(0);
                in_ZMM4 = ZEXT1664(auVar67);
                in_ZMM11 = ZEXT1664(auVar68);
                in_ZMM13 = ZEXT1664(auVar94);
                SVar205 = PortalImageInfiniteLight::Le
                                    ((PortalImageInfiniteLight *)this_01,&ray->super_Ray,lambda);
                auVar171._0_8_ = SVar205.values.values._8_8_;
                auVar171._8_56_ = auVar141;
                auVar68 = auVar171._0_16_;
                auVar131._0_8_ = SVar205.values.values._0_8_;
                auVar131._8_56_ = auVar172;
                auVar67 = auVar131._0_16_;
              }
            }
            auVar67 = vmovlhps_avx(auVar67,auVar68);
            auVar107._0_4_ = auVar67._0_4_ * local_1e8.values.values[0];
            auVar107._4_4_ = auVar67._4_4_ * local_1e8.values.values[1];
            auVar107._8_4_ = auVar67._8_4_ * local_1e8.values.values[2];
            auVar107._12_4_ = auVar67._12_4_ * local_1e8.values.values[3];
            auVar67 = *(undefined1 (*) [16])(lambda->pdf).values;
            uVar52 = vcmpps_avx512vl(auVar67,_DAT_005c8010,4);
            auVar67 = vdivps_avx512vl(auVar107,auVar67);
            fVar180 = (float)((uint)((byte)uVar52 & 1) * auVar67._0_4_);
            fVar139 = (float)((uint)((byte)(uVar52 >> 1) & 1) * auVar67._4_4_);
            in_ZmmResult._4_4_ = fVar139;
            in_ZmmResult._0_4_ = (int)fVar180;
            fVar179 = (float)((uint)((byte)(uVar52 >> 2) & 1) * auVar67._8_4_);
            in_ZmmResult._8_4_ = fVar179;
            fVar142 = (float)((uint)((byte)(uVar52 >> 3) & 1) * auVar67._12_4_);
            in_ZmmResult._12_4_ = fVar142;
            in_ZmmResult._16_48_ = auVar89;
            local_298.values.values[0] = fVar180 + local_298.values.values[0];
            local_298.values.values[1] = fVar139 + local_298.values.values[1];
            local_298.values.values[2] = fVar179 + local_298.values.values[2];
            local_298.values.values[3] = fVar142 + local_298.values.values[3];
          }
          goto LAB_004126b9;
        }
        uVar52._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
        uVar52._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar105._0_8_ = uVar52 ^ 0x8000000080000000;
        auVar105._8_4_ = 0x80000000;
        auVar105._12_4_ = 0x80000000;
        auVar153._0_4_ = -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar153._4_4_ = 0x80000000;
        auVar153._8_4_ = 0x80000000;
        auVar153._12_4_ = 0x80000000;
        uVar140 = vmovlps_avx(auVar105);
        IStack_3d0.low = auVar153._0_4_;
        local_3d8 = (undefined1  [8])uVar140;
        auVar172 = ZEXT856(auVar105._8_8_);
        auVar141 = ZEXT856(auVar153._8_8_);
        in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
        in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
        in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
        SVar205 = SurfaceInteraction::Le
                            ((SurfaceInteraction *)&local_138.__align,(Vector3f *)local_3d8,lambda);
        auVar168._0_8_ = SVar205.values.values._8_8_;
        auVar168._8_56_ = auVar141;
        auVar127._0_8_ = SVar205.values.values._0_8_;
        auVar127._8_56_ = auVar172;
        auVar67 = vmovlhps_avx(auVar127._0_16_,auVar168._0_16_);
        auVar106._0_4_ = auVar67._0_4_ * local_1e8.values.values[0];
        auVar106._4_4_ = auVar67._4_4_ * local_1e8.values.values[1];
        auVar106._8_4_ = auVar67._8_4_ * local_1e8.values.values[2];
        auVar106._12_4_ = auVar67._12_4_ * local_1e8.values.values[3];
        auVar67 = *(undefined1 (*) [16])(lambda->pdf).values;
        uVar52 = vcmpps_avx512vl(auVar67,_DAT_005c8010,4);
        auVar67 = vdivps_avx512vl(auVar106,auVar67);
        fVar142 = (float)((uint)((byte)uVar52 & 1) * auVar67._0_4_);
        fVar180 = (float)((uint)((byte)(uVar52 >> 1) & 1) * auVar67._4_4_);
        in_ZmmResult._4_4_ = fVar180;
        in_ZmmResult._0_4_ = (int)fVar142;
        fVar139 = (float)((uint)((byte)(uVar52 >> 2) & 1) * auVar67._8_4_);
        in_ZmmResult._8_4_ = fVar139;
        fVar179 = (float)((uint)((byte)(uVar52 >> 3) & 1) * auVar67._12_4_);
        in_ZmmResult._12_4_ = fVar179;
        in_ZmmResult._16_48_ = auVar89;
        local_298.values.values[0] = fVar142 + local_298.values.values[0];
        local_298.values.values[1] = fVar180 + local_298.values.values[1];
        local_298.values.values[2] = fVar139 + local_298.values.values[2];
        local_298.values.values[3] = fVar179 + local_298.values.values[3];
        local_148.bits =
             (local_3f8->super_RayIntegrator).super_ImageTileIntegrator.camera.
             super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
             .bits;
        local_150 = *local_308;
        SurfaceInteraction::GetBSDF
                  ((BSDF *)local_3d8,(SurfaceInteraction *)&local_138.__align,ray,lambda,
                   (CameraHandle *)&local_148,local_140,(SamplerHandle *)&local_150);
        pIVar51 = local_308;
        auVar67 = _local_3d8;
        if ((_local_3d8 & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0) {
          if ((byte)local_38 == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
          }
          iVar66 = 0;
          SurfaceInteraction::SkipIntersection
                    ((SurfaceInteraction *)&local_138.__align,ray,(Float)local_138._248_4_);
        }
        else {
          uVar5 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
          uVar8 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          local_4e8._4_4_ = uVar8;
          local_4e8._0_4_ = uVar5;
          _fStack_4e0 = 0;
          local_4b8 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
          local_480.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x = *local_308;
          FVar90 = detail::DispatchSplit<8>::operator()
                             (local_2f4,&local_480,
                              (ulong)local_480.super_Point3<pbrt::Interval<float>_>.
                                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x >> 0x30);
          local_408._0_4_ = FVar90;
          IVar91 = *pIVar51;
          sVar49 = IVar91.high._2_2_;
          if ((ulong)IVar91 >> 0x30 < 5) {
            this_00 = (HaltonSampler *)((ulong)IVar91 & 0xffffffffffff);
            if ((ulong)IVar91 < 0x3000000000000) {
              if (sVar49 == 2) {
                auVar128._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)this_00);
                auVar128._8_56_ = extraout_var_12;
                auVar68 = auVar128._0_16_;
              }
              else {
                auVar135._0_8_ = HaltonSampler::Get2D(this_00);
                auVar135._8_56_ = extraout_var_16;
                auVar68 = auVar135._0_16_;
              }
            }
            else if (sVar49 == 3) {
              auVar133._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)this_00);
              auVar133._8_56_ = extraout_var_14;
              auVar68 = auVar133._0_16_;
            }
            else {
              auVar137._0_8_ = RandomSampler::Get2D((RandomSampler *)this_00);
              auVar137._8_56_ = extraout_var_18;
              auVar68 = auVar137._0_16_;
            }
          }
          else {
            this_03 = (DebugMLTSampler *)((ulong)IVar91 & 0xffffffffffff);
            if ((ulong)IVar91 < 0x7000000000000) {
              if (sVar49 == 6) {
                auVar132._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)this_03);
                auVar132._8_56_ = extraout_var_13;
                auVar68 = auVar132._0_16_;
              }
              else {
                auVar136._0_8_ = SobolSampler::Get2D((SobolSampler *)this_03);
                auVar136._8_56_ = extraout_var_17;
                auVar68 = auVar136._0_16_;
              }
            }
            else if (sVar49 == 7) {
              auVar134._0_8_ = MLTSampler::Get2D((MLTSampler *)this_03);
              auVar134._8_56_ = extraout_var_15;
              auVar68 = auVar134._0_16_;
            }
            else {
              local_4c8._0_4_ = DebugMLTSampler::Get1D(this_03);
              local_4c8._4_4_ = extraout_XMM0_Db;
              local_4c8._8_4_ = extraout_XMM0_Dc;
              local_4c8._12_4_ = extraout_XMM0_Dd;
              auVar138._0_4_ = DebugMLTSampler::Get1D(this_03);
              auVar138._4_60_ = extraout_var_02;
              auVar68 = vinsertps_avx(local_4c8,auVar138._0_16_,0x10);
            }
          }
          woRender.super_Tuple3<pbrt::Vector3,_float>.z = -local_4b8._0_4_;
          uVar140 = vmovlps_avx(auVar68);
          local_480.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = (float)(int)uVar140;
          local_480.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high =
               (float)(int)((ulong)uVar140 >> 0x20);
          woRender.super_Tuple3<pbrt::Vector3,_float>.x =
               (float)(int)((ulong)local_4e8 ^ 0x8000000080000000);
          woRender.super_Tuple3<pbrt::Vector3,_float>.y =
               (float)(int)(((ulong)local_4e8 ^ 0x8000000080000000) >> 0x20);
          BSDF::Sample_f((BSDFSample *)local_280,(BSDF *)local_3d8,woRender,(Float)local_408._0_4_,
                         (Point2f *)&local_480,Radiance,All);
          iVar66 = 3;
          if (0.0 < (float)local_280._28_4_) {
            ErrorExit<>("SimpleVolPathIntegrator doesn\'t support scattering from surfaces");
          }
        }
        if ((auVar67 & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0) {
          iVar66 = 0;
        }
      }
    }
    else {
LAB_004126b9:
      iVar66 = 3;
    }
    if ((byte)local_38 == '\x01') {
      local_38 = local_38 & 0xffffffffffffff00;
    }
    if (iVar66 != 0) {
      aVar50.values[1] = local_298.values.values[1];
      aVar50.values[0] = local_298.values.values[0];
      aVar50.values[2] = local_298.values.values[2];
      aVar50.values[3] = local_298.values.values[3];
      return (array<float,_4>)(array<float,_4>)aVar50.values;
    }
  } while( true );
}

Assistant:

SampledSpectrum SimpleVolPathIntegrator::Li(RayDifferential ray,
                                            SampledWavelengths &lambda,
                                            SamplerHandle sampler,
                                            ScratchBuffer &scratchBuffer,
                                            VisibleSurface *) const {
    SampledSpectrum L(0.f), beta(1.f);
    int numScatters = 0;
    lambda.TerminateSecondary();
    while (true) {
        // Estimate radiance for ray path using delta tracking
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        bool scattered = false, terminated = false;
        if (ray.medium) {
            // Sample medium scattering for _SimpleVolPathIntegrator_
            Float tMax = si ? si->tHit : Infinity;
            RNG rng(Hash(sampler.Get1D()), Hash(sampler.Get1D()));
            ray.medium.SampleTmaj(ray, tMax, rng, lambda, [&](const MediumSample &ms) {
                // Update delta-tracking estimator for path sample
                if (!ms.intr)
                    return false;
                const MediumInteraction &intr = *ms.intr;
                const SampledSpectrum &sigma_a = intr.sigma_a, &sigma_s = intr.sigma_s;
                // Compute medium event probabilities for interaction
                Float pAbsorb = sigma_a[0] / intr.sigma_maj[0];
                Float pScatter = sigma_s[0] / intr.sigma_maj[0];
                Float pNull = std::max<Float>(0, 1 - pAbsorb - pScatter);

                // Randomly sample medium scattering event for delta-tracking
                Float u = sampler.Get1D();
                int mode = SampleDiscrete({pAbsorb, pScatter, pNull}, u);
                if (mode == 0) {
                    // Handle absorption event for delta-tracking
                    // absorbed; done
                    L += SafeDiv(intr.Le, lambda.PDF());
                    terminated = true;
                    return false;

                } else if (mode == 1) {
                    // Handle scattering event for delta-tracking
                    if (numScatters++ >= maxDepth) {
                        terminated = true;
                        return false;
                    }
                    Vector3f wi = SampleUniformSphere(sampler.Get2D());
                    beta *= intr.phase.p(-ray.d, wi) / UniformSpherePDF();
                    ray = intr.SpawnRay(wi);
                    scattered = true;
                    return false;

                } else {
                    // Handle null scattering event for delta-tracking
                    // null -- keep going...
                    return true;
                }
            });
        }
        if (terminated)
            break;
        if (!scattered) {
            // Add emission to un-scattered ray
            if (!si) {
                for (const auto &light : infiniteLights)
                    L += SafeDiv(beta * light.Le(ray, lambda), lambda.PDF());
                return L;
            }
            SurfaceInteraction &isect = si->intr;
            L += SafeDiv(beta * isect.Le(-ray.d, lambda), lambda.PDF());

            // Handle surface intersection for _SimpleVolPathIntegrator_
            BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
            if (!bsdf)
                isect.SkipIntersection(&ray, si->tHit);
            else if (bsdf.Sample_f(-ray.d, sampler.Get1D(), sampler.Get2D()))
                ErrorExit(
                    "SimpleVolPathIntegrator doesn't support scattering from surfaces");
            else
                break;
        }
    }
    return L;
}